

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  Geometry *pGVar18;
  RTCFilterFunctionN p_Var19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined1 auVar97 [32];
  undefined1 auVar98 [28];
  undefined1 auVar99 [28];
  byte bVar100;
  undefined1 auVar101 [32];
  bool bVar102;
  uint uVar103;
  int iVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  Geometry *geometry;
  long lVar108;
  ulong uVar109;
  undefined4 uVar110;
  undefined8 uVar111;
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar113 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  float fVar136;
  undefined1 auVar138 [16];
  float fVar137;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar139 [16];
  undefined1 auVar146 [32];
  undefined1 auVar140 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined8 uVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 in_ZMM10 [64];
  undefined4 uVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [64];
  float fVar202;
  undefined1 auVar204 [16];
  float fVar203;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar209;
  undefined1 in_ZMM12 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  RTCFilterFunctionNArguments args;
  ulong local_960;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  float local_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  LinearSpace3fa *local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  int iStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  ulong local_540;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  int local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar147 [32];
  
  PVar17 = prim[1];
  uVar109 = (ulong)(byte)PVar17;
  fVar137 = *(float *)(prim + uVar109 * 0x19 + 0x12);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar20 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + uVar109 * 0x19 + 6));
  auVar112._0_4_ = fVar137 * auVar20._0_4_;
  auVar112._4_4_ = fVar137 * auVar20._4_4_;
  auVar112._8_4_ = fVar137 * auVar20._8_4_;
  auVar112._12_4_ = fVar137 * auVar20._12_4_;
  auVar185._0_4_ = fVar137 * auVar21._0_4_;
  auVar185._4_4_ = fVar137 * auVar21._4_4_;
  auVar185._8_4_ = fVar137 * auVar21._8_4_;
  auVar185._12_4_ = fVar137 * auVar21._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar109 * 4 + 6);
  auVar115 = vpmovsxbd_avx2(auVar20);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar109 * 5 + 6);
  auVar156 = vpmovsxbd_avx2(auVar21);
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar109 * 6 + 6);
  auVar124 = vpmovsxbd_avx2(auVar10);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar109 * 0xb + 6);
  auVar170 = vpmovsxbd_avx2(auVar11);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar17 * 0xc) + 6);
  auVar150 = vpmovsxbd_avx2(auVar12);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (uint)(byte)PVar17 * 0xc + uVar109 + 6);
  auVar22 = vpmovsxbd_avx2(auVar13);
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar105 = (ulong)(uint)((int)(uVar109 * 9) * 2);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar105 + 6);
  auVar23 = vpmovsxbd_avx2(auVar14);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar105 + uVar109 + 6);
  auVar166 = vpmovsxbd_avx2(auVar15);
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar201 = ZEXT3264(auVar166);
  uVar105 = (ulong)(uint)((int)(uVar109 * 5) << 2);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar105 + 6);
  auVar24 = vpmovsxbd_avx2(auVar16);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar181._4_4_ = auVar185._0_4_;
  auVar181._0_4_ = auVar185._0_4_;
  auVar181._8_4_ = auVar185._0_4_;
  auVar181._12_4_ = auVar185._0_4_;
  auVar181._16_4_ = auVar185._0_4_;
  auVar181._20_4_ = auVar185._0_4_;
  auVar181._24_4_ = auVar185._0_4_;
  auVar181._28_4_ = auVar185._0_4_;
  auVar20 = vmovshdup_avx(auVar185);
  uVar184 = auVar20._0_8_;
  auVar222._8_8_ = uVar184;
  auVar222._0_8_ = uVar184;
  auVar222._16_8_ = uVar184;
  auVar222._24_8_ = uVar184;
  auVar20 = vshufps_avx(auVar185,auVar185,0xaa);
  fVar137 = auVar20._0_4_;
  auVar135._0_4_ = fVar137 * auVar124._0_4_;
  fVar136 = auVar20._4_4_;
  auVar135._4_4_ = fVar136 * auVar124._4_4_;
  auVar135._8_4_ = fVar137 * auVar124._8_4_;
  auVar135._12_4_ = fVar136 * auVar124._12_4_;
  auVar135._16_4_ = fVar137 * auVar124._16_4_;
  auVar135._20_4_ = fVar136 * auVar124._20_4_;
  auVar135._28_36_ = in_ZMM12._28_36_;
  auVar135._24_4_ = fVar137 * auVar124._24_4_;
  auVar195._0_4_ = auVar22._0_4_ * fVar137;
  auVar195._4_4_ = auVar22._4_4_ * fVar136;
  auVar195._8_4_ = auVar22._8_4_ * fVar137;
  auVar195._12_4_ = auVar22._12_4_ * fVar136;
  auVar195._16_4_ = auVar22._16_4_ * fVar137;
  auVar195._20_4_ = auVar22._20_4_ * fVar136;
  auVar195._28_36_ = in_ZMM10._28_36_;
  auVar195._24_4_ = auVar22._24_4_ * fVar137;
  auVar191._0_4_ = auVar24._0_4_ * fVar137;
  auVar191._4_4_ = auVar24._4_4_ * fVar136;
  auVar191._8_4_ = auVar24._8_4_ * fVar137;
  auVar191._12_4_ = auVar24._12_4_ * fVar136;
  auVar191._16_4_ = auVar24._16_4_ * fVar137;
  auVar191._20_4_ = auVar24._20_4_ * fVar136;
  auVar191._24_4_ = auVar24._24_4_ * fVar137;
  auVar191._28_4_ = 0;
  auVar20 = vfmadd231ps_fma(auVar135._0_32_,auVar222,auVar156);
  auVar21 = vfmadd231ps_fma(auVar195._0_32_,auVar222,auVar150);
  auVar10 = vfmadd231ps_fma(auVar191,auVar166,auVar222);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar181,auVar115);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar181,auVar170);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar23,auVar181);
  auVar213._4_4_ = auVar112._0_4_;
  auVar213._0_4_ = auVar112._0_4_;
  auVar213._8_4_ = auVar112._0_4_;
  auVar213._12_4_ = auVar112._0_4_;
  auVar213._16_4_ = auVar112._0_4_;
  auVar213._20_4_ = auVar112._0_4_;
  auVar213._24_4_ = auVar112._0_4_;
  auVar213._28_4_ = auVar112._0_4_;
  auVar20 = vmovshdup_avx(auVar112);
  uVar184 = auVar20._0_8_;
  auVar223._8_8_ = uVar184;
  auVar223._0_8_ = uVar184;
  auVar223._16_8_ = uVar184;
  auVar223._24_8_ = uVar184;
  auVar20 = vshufps_avx(auVar112,auVar112,0xaa);
  fVar137 = auVar20._0_4_;
  auVar188._0_4_ = fVar137 * auVar124._0_4_;
  fVar136 = auVar20._4_4_;
  auVar188._4_4_ = fVar136 * auVar124._4_4_;
  auVar188._8_4_ = fVar137 * auVar124._8_4_;
  auVar188._12_4_ = fVar136 * auVar124._12_4_;
  auVar188._16_4_ = fVar137 * auVar124._16_4_;
  auVar188._20_4_ = fVar136 * auVar124._20_4_;
  auVar188._24_4_ = fVar137 * auVar124._24_4_;
  auVar188._28_4_ = 0;
  auVar126._4_4_ = auVar22._4_4_ * fVar136;
  auVar126._0_4_ = auVar22._0_4_ * fVar137;
  auVar126._8_4_ = auVar22._8_4_ * fVar137;
  auVar126._12_4_ = auVar22._12_4_ * fVar136;
  auVar126._16_4_ = auVar22._16_4_ * fVar137;
  auVar126._20_4_ = auVar22._20_4_ * fVar136;
  auVar126._24_4_ = auVar22._24_4_ * fVar137;
  auVar126._28_4_ = auVar124._28_4_;
  auVar124._4_4_ = auVar24._4_4_ * fVar136;
  auVar124._0_4_ = auVar24._0_4_ * fVar137;
  auVar124._8_4_ = auVar24._8_4_ * fVar137;
  auVar124._12_4_ = auVar24._12_4_ * fVar136;
  auVar124._16_4_ = auVar24._16_4_ * fVar137;
  auVar124._20_4_ = auVar24._20_4_ * fVar136;
  auVar124._24_4_ = auVar24._24_4_ * fVar137;
  auVar124._28_4_ = fVar136;
  auVar20 = vfmadd231ps_fma(auVar188,auVar223,auVar156);
  auVar12 = vfmadd231ps_fma(auVar126,auVar223,auVar150);
  auVar13 = vfmadd231ps_fma(auVar124,auVar223,auVar166);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar213,auVar115);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar213,auVar170);
  local_400._8_4_ = 0x7fffffff;
  local_400._0_8_ = 0x7fffffff7fffffff;
  local_400._12_4_ = 0x7fffffff;
  local_400._16_4_ = 0x7fffffff;
  local_400._20_4_ = 0x7fffffff;
  local_400._24_4_ = 0x7fffffff;
  local_400._28_4_ = 0x7fffffff;
  auVar117._8_4_ = 0x219392ef;
  auVar117._0_8_ = 0x219392ef219392ef;
  auVar117._12_4_ = 0x219392ef;
  auVar117._16_4_ = 0x219392ef;
  auVar117._20_4_ = 0x219392ef;
  auVar117._24_4_ = 0x219392ef;
  auVar117._28_4_ = 0x219392ef;
  auVar115 = vandps_avx(ZEXT1632(auVar11),local_400);
  auVar115 = vcmpps_avx(auVar115,auVar117,1);
  auVar156 = vblendvps_avx(ZEXT1632(auVar11),auVar117,auVar115);
  auVar115 = vandps_avx(ZEXT1632(auVar21),local_400);
  auVar115 = vcmpps_avx(auVar115,auVar117,1);
  auVar124 = vblendvps_avx(ZEXT1632(auVar21),auVar117,auVar115);
  auVar115 = vandps_avx(ZEXT1632(auVar10),local_400);
  auVar115 = vcmpps_avx(auVar115,auVar117,1);
  auVar115 = vblendvps_avx(ZEXT1632(auVar10),auVar117,auVar115);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar213,auVar23);
  auVar170 = vrcpps_avx(auVar156);
  auVar163._8_4_ = 0x3f800000;
  auVar163._0_8_ = 0x3f8000003f800000;
  auVar163._12_4_ = 0x3f800000;
  auVar163._16_4_ = 0x3f800000;
  auVar163._20_4_ = 0x3f800000;
  auVar163._24_4_ = 0x3f800000;
  auVar163._28_4_ = 0x3f800000;
  auVar20 = vfnmadd213ps_fma(auVar156,auVar170,auVar163);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar170,auVar170);
  auVar156 = vrcpps_avx(auVar124);
  auVar21 = vfnmadd213ps_fma(auVar124,auVar156,auVar163);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar156,auVar156);
  auVar156 = vrcpps_avx(auVar115);
  auVar10 = vfnmadd213ps_fma(auVar115,auVar156,auVar163);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar156,auVar156);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar109 * 7 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar14));
  auVar170._4_4_ = auVar20._4_4_ * auVar115._4_4_;
  auVar170._0_4_ = auVar20._0_4_ * auVar115._0_4_;
  auVar170._8_4_ = auVar20._8_4_ * auVar115._8_4_;
  auVar170._12_4_ = auVar20._12_4_ * auVar115._12_4_;
  auVar170._16_4_ = auVar115._16_4_ * 0.0;
  auVar170._20_4_ = auVar115._20_4_ * 0.0;
  auVar170._24_4_ = auVar115._24_4_ * 0.0;
  auVar170._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar109 * 9 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar14));
  auVar150._4_4_ = auVar20._4_4_ * auVar115._4_4_;
  auVar150._0_4_ = auVar20._0_4_ * auVar115._0_4_;
  auVar150._8_4_ = auVar20._8_4_ * auVar115._8_4_;
  auVar150._12_4_ = auVar20._12_4_ * auVar115._12_4_;
  auVar150._16_4_ = auVar115._16_4_ * 0.0;
  auVar150._20_4_ = auVar115._20_4_ * 0.0;
  auVar150._24_4_ = auVar115._24_4_ * 0.0;
  auVar150._28_4_ = auVar115._28_4_;
  auVar127._1_3_ = 0;
  auVar127[0] = PVar17;
  auVar156 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar17 * 0x10 + 6));
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar17 * 0x10 + uVar109 * -2 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar12));
  auVar22._4_4_ = auVar115._4_4_ * auVar21._4_4_;
  auVar22._0_4_ = auVar115._0_4_ * auVar21._0_4_;
  auVar22._8_4_ = auVar115._8_4_ * auVar21._8_4_;
  auVar22._12_4_ = auVar115._12_4_ * auVar21._12_4_;
  auVar22._16_4_ = auVar115._16_4_ * 0.0;
  auVar22._20_4_ = auVar115._20_4_ * 0.0;
  auVar22._24_4_ = auVar115._24_4_ * 0.0;
  auVar22._28_4_ = auVar115._28_4_;
  auVar115 = vcvtdq2ps_avx(auVar156);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar12));
  auVar23._4_4_ = auVar21._4_4_ * auVar115._4_4_;
  auVar23._0_4_ = auVar21._0_4_ * auVar115._0_4_;
  auVar23._8_4_ = auVar21._8_4_ * auVar115._8_4_;
  auVar23._12_4_ = auVar21._12_4_ * auVar115._12_4_;
  auVar23._16_4_ = auVar115._16_4_ * 0.0;
  auVar23._20_4_ = auVar115._20_4_ * 0.0;
  auVar23._24_4_ = auVar115._24_4_ * 0.0;
  auVar23._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 + uVar109 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar11));
  auVar166._4_4_ = auVar115._4_4_ * auVar10._4_4_;
  auVar166._0_4_ = auVar115._0_4_ * auVar10._0_4_;
  auVar166._8_4_ = auVar115._8_4_ * auVar10._8_4_;
  auVar166._12_4_ = auVar115._12_4_ * auVar10._12_4_;
  auVar166._16_4_ = auVar115._16_4_ * 0.0;
  auVar166._20_4_ = auVar115._20_4_ * 0.0;
  auVar166._24_4_ = auVar115._24_4_ * 0.0;
  auVar166._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar109 * 0x17 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar11));
  auVar24._4_4_ = auVar10._4_4_ * auVar115._4_4_;
  auVar24._0_4_ = auVar10._0_4_ * auVar115._0_4_;
  auVar24._8_4_ = auVar10._8_4_ * auVar115._8_4_;
  auVar24._12_4_ = auVar10._12_4_ * auVar115._12_4_;
  auVar24._16_4_ = auVar115._16_4_ * 0.0;
  auVar24._20_4_ = auVar115._20_4_ * 0.0;
  auVar24._24_4_ = auVar115._24_4_ * 0.0;
  auVar24._28_4_ = auVar115._28_4_;
  auVar115 = vpminsd_avx2(auVar170,auVar150);
  auVar156 = vpminsd_avx2(auVar22,auVar23);
  auVar115 = vmaxps_avx(auVar115,auVar156);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar189._4_4_ = uVar110;
  auVar189._0_4_ = uVar110;
  auVar189._8_4_ = uVar110;
  auVar189._12_4_ = uVar110;
  auVar189._16_4_ = uVar110;
  auVar189._20_4_ = uVar110;
  auVar189._24_4_ = uVar110;
  auVar189._28_4_ = uVar110;
  auVar156 = vpminsd_avx2(auVar166,auVar24);
  auVar156 = vmaxps_avx(auVar156,auVar189);
  auVar195 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                CONCAT424(0x3f7ffffa,
                                          CONCAT420(0x3f7ffffa,
                                                    CONCAT416(0x3f7ffffa,
                                                              CONCAT412(0x3f7ffffa,
                                                                        CONCAT48(0x3f7ffffa,
                                                                                 0x3f7ffffa3f7ffffa)
                                                                       ))))));
  auVar115 = vmaxps_avx(auVar115,auVar156);
  local_80._4_4_ = auVar115._4_4_ * 0.99999964;
  local_80._0_4_ = auVar115._0_4_ * 0.99999964;
  local_80._8_4_ = auVar115._8_4_ * 0.99999964;
  local_80._12_4_ = auVar115._12_4_ * 0.99999964;
  local_80._16_4_ = auVar115._16_4_ * 0.99999964;
  local_80._20_4_ = auVar115._20_4_ * 0.99999964;
  local_80._24_4_ = auVar115._24_4_ * 0.99999964;
  local_80._28_4_ = auVar156._28_4_;
  auVar115 = vpmaxsd_avx2(auVar170,auVar150);
  auVar156 = vpmaxsd_avx2(auVar22,auVar23);
  auVar115 = vminps_avx(auVar115,auVar156);
  auVar156 = vpmaxsd_avx2(auVar166,auVar24);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar143._4_4_ = uVar110;
  auVar143._0_4_ = uVar110;
  auVar143._8_4_ = uVar110;
  auVar143._12_4_ = uVar110;
  auVar143._16_4_ = uVar110;
  auVar143._20_4_ = uVar110;
  auVar143._24_4_ = uVar110;
  auVar143._28_4_ = uVar110;
  auVar156 = vminps_avx(auVar156,auVar143);
  auVar115 = vminps_avx(auVar115,auVar156);
  auVar192._4_4_ = auVar115._4_4_ * 1.0000004;
  auVar192._0_4_ = auVar115._0_4_ * 1.0000004;
  auVar192._8_4_ = auVar115._8_4_ * 1.0000004;
  auVar192._12_4_ = auVar115._12_4_ * 1.0000004;
  auVar192._16_4_ = auVar115._16_4_ * 1.0000004;
  auVar192._20_4_ = auVar115._20_4_ * 1.0000004;
  auVar192._24_4_ = auVar115._24_4_ * 1.0000004;
  auVar192._28_4_ = auVar115._28_4_;
  auVar127[4] = PVar17;
  auVar127._5_3_ = 0;
  auVar127[8] = PVar17;
  auVar127._9_3_ = 0;
  auVar127[0xc] = PVar17;
  auVar127._13_3_ = 0;
  auVar127[0x10] = PVar17;
  auVar127._17_3_ = 0;
  auVar127[0x14] = PVar17;
  auVar127._21_3_ = 0;
  auVar127[0x18] = PVar17;
  auVar127._25_3_ = 0;
  auVar127[0x1c] = PVar17;
  auVar127._29_3_ = 0;
  auVar156 = vpcmpgtd_avx2(auVar127,_DAT_01fe9900);
  auVar115 = vcmpps_avx(local_80,auVar192,2);
  auVar115 = vandps_avx(auVar115,auVar156);
  uVar103 = vmovmskps_avx(auVar115);
  if (uVar103 == 0) {
    bVar102 = false;
  }
  else {
    uVar103 = uVar103 & 0xff;
    local_648 = pre->ray_space + k;
    local_640 = mm_lookupmask_ps._16_8_;
    uStack_638 = mm_lookupmask_ps._24_8_;
    uStack_630 = mm_lookupmask_ps._16_8_;
    uStack_628 = mm_lookupmask_ps._24_8_;
    iVar104 = 1 << ((uint)k & 0x1f);
    auVar115._4_4_ = iVar104;
    auVar115._0_4_ = iVar104;
    auVar115._8_4_ = iVar104;
    auVar115._12_4_ = iVar104;
    auVar115._16_4_ = iVar104;
    auVar115._20_4_ = iVar104;
    auVar115._24_4_ = iVar104;
    auVar115._28_4_ = iVar104;
    auVar156 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar115 = vpand_avx2(auVar115,auVar156);
    local_420 = vpcmpeqd_avx2(auVar115,auVar156);
    local_430 = 0x7fffffff;
    uStack_42c = 0x7fffffff;
    uStack_428 = 0x7fffffff;
    uStack_424 = 0x7fffffff;
    do {
      auVar115 = local_520;
      local_740 = auVar195._0_32_;
      auVar156 = auVar201._0_32_;
      lVar25 = 0;
      uVar109 = (ulong)uVar103;
      for (uVar105 = uVar109; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      local_940._4_4_ = *(undefined4 *)(prim + 2);
      local_6a0._4_4_ = *(undefined4 *)(prim + lVar25 * 4 + 6);
      local_540 = (ulong)(uint)local_6a0._4_4_;
      pGVar18 = (context->scene->geometries).items[(uint)local_940._4_4_].ptr;
      uVar105 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                                pGVar18[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * local_540);
      p_Var19 = pGVar18[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar18[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar25 + (long)p_Var19 * uVar105);
      uVar184 = *(undefined8 *)*pauVar1;
      uVar92 = *(undefined8 *)(*pauVar1 + 8);
      auVar13 = *pauVar1;
      auVar10 = *pauVar1;
      pauVar2 = (undefined1 (*) [16])(lVar25 + (uVar105 + 1) * (long)p_Var19);
      uVar93 = *(undefined8 *)*pauVar2;
      uVar94 = *(undefined8 *)(*pauVar2 + 8);
      auVar12 = *pauVar2;
      auVar21 = *pauVar2;
      pauVar3 = (undefined1 (*) [16])(lVar25 + (uVar105 + 2) * (long)p_Var19);
      uVar95 = *(undefined8 *)*pauVar3;
      uVar96 = *(undefined8 *)(*pauVar3 + 8);
      auVar11 = *pauVar3;
      auVar20 = *pauVar3;
      uVar109 = uVar109 - 1 & uVar109;
      pauVar4 = (undefined1 (*) [12])(lVar25 + (uVar105 + 3) * (long)p_Var19);
      local_6f0 = (float)*(undefined8 *)*pauVar4;
      fStack_6ec = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
      fStack_6e8 = (float)*(undefined8 *)(*pauVar4 + 8);
      fStack_6e4 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
      if (uVar109 != 0) {
        uVar106 = uVar109 - 1 & uVar109;
        for (uVar105 = uVar109; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000) {
        }
        if (uVar106 != 0) {
          for (; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar104 = (int)pGVar18[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar112 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar15 = vsubps_avx(*pauVar1,auVar112);
      uVar110 = auVar15._0_4_;
      auVar157._4_4_ = uVar110;
      auVar157._0_4_ = uVar110;
      auVar157._8_4_ = uVar110;
      auVar157._12_4_ = uVar110;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      aVar8 = (local_648->vx).field_0;
      aVar9 = (local_648->vy).field_0;
      fVar137 = (local_648->vz).field_0.m128[0];
      fVar136 = *(float *)((long)&(local_648->vz).field_0 + 4);
      fVar171 = *(float *)((long)&(local_648->vz).field_0 + 8);
      fVar172 = *(float *)((long)&(local_648->vz).field_0 + 0xc);
      auVar177._0_4_ = fVar137 * auVar15._0_4_;
      auVar177._4_4_ = fVar136 * auVar15._4_4_;
      auVar177._8_4_ = fVar171 * auVar15._8_4_;
      auVar177._12_4_ = fVar172 * auVar15._12_4_;
      auVar14 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar9,auVar14);
      auVar157 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar8,auVar157);
      auVar14 = vblendps_avx(auVar157,*pauVar1,8);
      auVar16 = vsubps_avx(*pauVar2,auVar112);
      uVar110 = auVar16._0_4_;
      auVar178._4_4_ = uVar110;
      auVar178._0_4_ = uVar110;
      auVar178._8_4_ = uVar110;
      auVar178._12_4_ = uVar110;
      auVar15 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar196._0_4_ = fVar137 * auVar16._0_4_;
      auVar196._4_4_ = fVar136 * auVar16._4_4_;
      auVar196._8_4_ = fVar171 * auVar16._8_4_;
      auVar196._12_4_ = fVar172 * auVar16._12_4_;
      auVar15 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar9,auVar15);
      auVar177 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar8,auVar178);
      auVar15 = vblendps_avx(auVar177,*pauVar2,8);
      auVar185 = vsubps_avx(*pauVar3,auVar112);
      uVar110 = auVar185._0_4_;
      auVar186._4_4_ = uVar110;
      auVar186._0_4_ = uVar110;
      auVar186._8_4_ = uVar110;
      auVar186._12_4_ = uVar110;
      auVar16 = vshufps_avx(auVar185,auVar185,0x55);
      auVar185 = vshufps_avx(auVar185,auVar185,0xaa);
      auVar200._0_4_ = fVar137 * auVar185._0_4_;
      auVar200._4_4_ = fVar136 * auVar185._4_4_;
      auVar200._8_4_ = fVar171 * auVar185._8_4_;
      auVar200._12_4_ = fVar172 * auVar185._12_4_;
      auVar16 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar9,auVar16);
      auVar178 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar8,auVar186);
      auVar16 = vblendps_avx(auVar178,*pauVar3,8);
      auVar26._12_4_ = fStack_6e4;
      auVar26._0_12_ = *pauVar4;
      auVar185 = vsubps_avx(auVar26,auVar112);
      uVar110 = auVar185._0_4_;
      auVar187._4_4_ = uVar110;
      auVar187._0_4_ = uVar110;
      auVar187._8_4_ = uVar110;
      auVar187._12_4_ = uVar110;
      auVar112 = vshufps_avx(auVar185,auVar185,0x55);
      auVar185 = vshufps_avx(auVar185,auVar185,0xaa);
      auVar204._0_4_ = fVar137 * auVar185._0_4_;
      auVar204._4_4_ = fVar136 * auVar185._4_4_;
      auVar204._8_4_ = fVar171 * auVar185._8_4_;
      auVar204._12_4_ = fVar172 * auVar185._12_4_;
      auVar112 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar9,auVar112);
      auVar186 = vfmadd231ps_fma(auVar112,(undefined1  [16])aVar8,auVar187);
      auVar112 = vblendps_avx(auVar186,auVar26,8);
      auVar28._4_4_ = uStack_42c;
      auVar28._0_4_ = local_430;
      auVar28._8_4_ = uStack_428;
      auVar28._12_4_ = uStack_424;
      auVar14 = vandps_avx(auVar14,auVar28);
      auVar15 = vandps_avx(auVar15,auVar28);
      auVar185 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vandps_avx(auVar16,auVar28);
      auVar15 = vandps_avx(auVar112,auVar28);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar185,auVar14);
      auVar15 = vmovshdup_avx(auVar14);
      auVar15 = vmaxss_avx(auVar15,auVar14);
      auVar14 = vshufpd_avx(auVar14,auVar14,1);
      auVar14 = vmaxss_avx(auVar14,auVar15);
      lVar25 = (long)iVar104 * 0x44;
      auVar15 = vmovshdup_avx(auVar157);
      uVar111 = auVar15._0_8_;
      local_600._8_8_ = uVar111;
      local_600._0_8_ = uVar111;
      local_600._16_8_ = uVar111;
      local_600._24_8_ = uVar111;
      auVar124 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x484);
      auVar15 = vmovshdup_avx(auVar177);
      uVar111 = auVar15._0_8_;
      auVar153._8_8_ = uVar111;
      auVar153._0_8_ = uVar111;
      auVar153._16_8_ = uVar111;
      auVar153._24_8_ = uVar111;
      auVar170 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x908);
      uVar199 = auVar178._0_4_;
      auVar144._4_4_ = uVar199;
      auVar144._0_4_ = uVar199;
      auVar144._8_4_ = uVar199;
      auVar144._12_4_ = uVar199;
      auVar144._16_4_ = uVar199;
      auVar144._20_4_ = uVar199;
      auVar144._24_4_ = uVar199;
      auVar144._28_4_ = uVar199;
      auVar15 = vmovshdup_avx(auVar178);
      uVar111 = auVar15._0_8_;
      auVar164._8_8_ = uVar111;
      auVar164._0_8_ = uVar111;
      auVar164._16_8_ = uVar111;
      auVar164._24_8_ = uVar111;
      fVar136 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar25 + 0xd8c);
      fVar171 = *(float *)(catmullrom_basis0 + lVar25 + 0xd90);
      fVar172 = *(float *)(catmullrom_basis0 + lVar25 + 0xd94);
      fVar173 = *(float *)(catmullrom_basis0 + lVar25 + 0xd98);
      fVar174 = *(float *)(catmullrom_basis0 + lVar25 + 0xd9c);
      fVar175 = *(float *)(catmullrom_basis0 + lVar25 + 0xda0);
      fVar176 = *(float *)(catmullrom_basis0 + lVar25 + 0xda4);
      auVar98 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar25 + 0xd8c);
      fVar202 = auVar186._0_4_;
      auVar16 = vmovshdup_avx(auVar186);
      auVar179._0_4_ = fVar136 * fVar202;
      auVar179._4_4_ = fVar171 * fVar202;
      auVar179._8_4_ = fVar172 * fVar202;
      auVar179._12_4_ = fVar173 * fVar202;
      auVar179._16_4_ = fVar174 * fVar202;
      auVar179._20_4_ = fVar175 * fVar202;
      auVar179._24_4_ = fVar176 * fVar202;
      auVar179._28_4_ = 0;
      fVar210 = auVar16._0_4_;
      auVar116._0_4_ = fVar210 * fVar136;
      fVar211 = auVar16._4_4_;
      auVar116._4_4_ = fVar211 * fVar171;
      auVar116._8_4_ = fVar210 * fVar172;
      auVar116._12_4_ = fVar211 * fVar173;
      auVar116._16_4_ = fVar210 * fVar174;
      auVar116._20_4_ = fVar211 * fVar175;
      auVar116._24_4_ = fVar210 * fVar176;
      auVar116._28_4_ = 0;
      auVar16 = vfmadd231ps_fma(auVar179,auVar170,auVar144);
      auVar112 = vfmadd231ps_fma(auVar116,auVar170,auVar164);
      uVar110 = auVar177._0_4_;
      auVar224._4_4_ = uVar110;
      auVar224._0_4_ = uVar110;
      auVar224._8_4_ = uVar110;
      auVar224._12_4_ = uVar110;
      auVar224._16_4_ = uVar110;
      auVar224._20_4_ = uVar110;
      auVar224._24_4_ = uVar110;
      auVar224._28_4_ = uVar110;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar124,auVar224);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar124,auVar153);
      auVar150 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25);
      uVar110 = auVar157._0_4_;
      auVar214._4_4_ = uVar110;
      auVar214._0_4_ = uVar110;
      auVar214._8_4_ = uVar110;
      auVar214._12_4_ = uVar110;
      auVar214._16_4_ = uVar110;
      auVar214._20_4_ = uVar110;
      auVar214._24_4_ = uVar110;
      auVar214._28_4_ = uVar110;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar150,auVar214);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar150,local_600);
      auVar22 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x908);
      pauVar5 = (undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0xd8c);
      fVar203 = *(float *)*pauVar5;
      fVar209 = *(float *)(catmullrom_basis1 + lVar25 + 0xd90);
      fVar87 = *(float *)(catmullrom_basis1 + lVar25 + 0xd94);
      fVar88 = *(float *)(catmullrom_basis1 + lVar25 + 0xd98);
      fVar89 = *(float *)(catmullrom_basis1 + lVar25 + 0xd9c);
      fVar90 = *(float *)(catmullrom_basis1 + lVar25 + 0xda0);
      fVar91 = *(float *)(catmullrom_basis1 + lVar25 + 0xda4);
      auVar99 = *(undefined1 (*) [28])*pauVar5;
      auVar29._4_4_ = fVar202 * fVar209;
      auVar29._0_4_ = fVar202 * fVar203;
      auVar29._8_4_ = fVar202 * fVar87;
      auVar29._12_4_ = fVar202 * fVar88;
      auVar29._16_4_ = fVar202 * fVar89;
      auVar29._20_4_ = fVar202 * fVar90;
      auVar29._24_4_ = fVar202 * fVar91;
      auVar29._28_4_ = fVar202;
      auVar185 = vfmadd231ps_fma(auVar29,auVar22,auVar144);
      auVar30._4_4_ = fVar211 * fVar209;
      auVar30._0_4_ = fVar210 * fVar203;
      auVar30._8_4_ = fVar210 * fVar87;
      auVar30._12_4_ = fVar211 * fVar88;
      auVar30._16_4_ = fVar210 * fVar89;
      auVar30._20_4_ = fVar211 * fVar90;
      auVar30._24_4_ = fVar210 * fVar91;
      auVar30._28_4_ = uVar199;
      auVar26 = vfmadd231ps_fma(auVar30,auVar22,auVar164);
      auVar23 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x484);
      auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar23,auVar224);
      auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar23,auVar153);
      auVar166 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25);
      auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar166,auVar214);
      auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar166,local_600);
      local_460 = ZEXT1632(auVar185);
      local_5c0 = ZEXT1632(auVar16);
      auVar126 = vsubps_avx(local_460,local_5c0);
      local_480 = ZEXT1632(auVar26);
      auVar117 = ZEXT1632(auVar112);
      auVar192 = vsubps_avx(local_480,auVar117);
      auVar118._0_4_ = auVar126._0_4_ * auVar112._0_4_;
      auVar118._4_4_ = auVar126._4_4_ * auVar112._4_4_;
      auVar118._8_4_ = auVar126._8_4_ * auVar112._8_4_;
      auVar118._12_4_ = auVar126._12_4_ * auVar112._12_4_;
      auVar118._16_4_ = auVar126._16_4_ * 0.0;
      auVar118._20_4_ = auVar126._20_4_ * 0.0;
      auVar118._24_4_ = auVar126._24_4_ * 0.0;
      auVar118._28_4_ = 0;
      fVar212 = auVar192._0_4_;
      auVar128._0_4_ = fVar212 * auVar16._0_4_;
      fVar216 = auVar192._4_4_;
      auVar128._4_4_ = fVar216 * auVar16._4_4_;
      fVar217 = auVar192._8_4_;
      auVar128._8_4_ = fVar217 * auVar16._8_4_;
      fVar218 = auVar192._12_4_;
      auVar128._12_4_ = fVar218 * auVar16._12_4_;
      fVar219 = auVar192._16_4_;
      auVar128._16_4_ = fVar219 * 0.0;
      fVar220 = auVar192._20_4_;
      auVar128._20_4_ = fVar220 * 0.0;
      fVar221 = auVar192._24_4_;
      auVar128._24_4_ = fVar221 * 0.0;
      auVar128._28_4_ = 0;
      auVar127 = vsubps_avx(auVar118,auVar128);
      auVar16 = vpermilps_avx(*pauVar1,0xff);
      uVar111 = auVar16._0_8_;
      local_a0._8_8_ = uVar111;
      local_a0._0_8_ = uVar111;
      local_a0._16_8_ = uVar111;
      local_a0._24_8_ = uVar111;
      auVar112 = vpermilps_avx(*pauVar2,0xff);
      uVar111 = auVar112._0_8_;
      local_c0._8_8_ = uVar111;
      local_c0._0_8_ = uVar111;
      local_c0._16_8_ = uVar111;
      local_c0._24_8_ = uVar111;
      auVar112 = vpermilps_avx(*pauVar3,0xff);
      uVar111 = auVar112._0_8_;
      local_e0._8_8_ = uVar111;
      local_e0._0_8_ = uVar111;
      local_e0._16_8_ = uVar111;
      local_e0._24_8_ = uVar111;
      auVar27._12_4_ = fStack_6e4;
      auVar27._0_12_ = *pauVar4;
      auVar112 = vpermilps_avx(auVar27,0xff);
      local_100 = auVar112._0_8_;
      fVar137 = auVar112._0_4_;
      auVar180._0_4_ = fVar136 * fVar137;
      fVar136 = auVar112._4_4_;
      auVar180._4_4_ = fVar171 * fVar136;
      auVar180._8_4_ = fVar172 * fVar137;
      auVar180._12_4_ = fVar173 * fVar136;
      auVar180._16_4_ = fVar174 * fVar137;
      auVar180._20_4_ = fVar175 * fVar136;
      auVar180._24_4_ = fVar176 * fVar137;
      auVar180._28_4_ = 0;
      auVar112 = vfmadd231ps_fma(auVar180,local_e0,auVar170);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),local_c0,auVar124);
      auVar185 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar150,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar31._4_4_ = fVar136 * fVar209;
      auVar31._0_4_ = fVar137 * fVar203;
      auVar31._8_4_ = fVar137 * fVar87;
      auVar31._12_4_ = fVar136 * fVar88;
      auVar31._16_4_ = fVar137 * fVar89;
      auVar31._20_4_ = fVar136 * fVar90;
      auVar31._24_4_ = fVar137 * fVar91;
      auVar31._28_4_ = auVar150._28_4_;
      auVar112 = vfmadd231ps_fma(auVar31,auVar22,local_e0);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar23,local_c0);
      auVar26 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar166,local_a0);
      auVar32._4_4_ = fVar216 * fVar216;
      auVar32._0_4_ = fVar212 * fVar212;
      auVar32._8_4_ = fVar217 * fVar217;
      auVar32._12_4_ = fVar218 * fVar218;
      auVar32._16_4_ = fVar219 * fVar219;
      auVar32._20_4_ = fVar220 * fVar220;
      auVar32._24_4_ = fVar221 * fVar221;
      auVar32._28_4_ = auVar16._4_4_;
      auVar16 = vfmadd231ps_fma(auVar32,auVar126,auVar126);
      auVar24 = vmaxps_avx(ZEXT1632(auVar185),ZEXT1632(auVar26));
      auVar33._4_4_ = auVar24._4_4_ * auVar24._4_4_ * auVar16._4_4_;
      auVar33._0_4_ = auVar24._0_4_ * auVar24._0_4_ * auVar16._0_4_;
      auVar33._8_4_ = auVar24._8_4_ * auVar24._8_4_ * auVar16._8_4_;
      auVar33._12_4_ = auVar24._12_4_ * auVar24._12_4_ * auVar16._12_4_;
      auVar33._16_4_ = auVar24._16_4_ * auVar24._16_4_ * 0.0;
      auVar33._20_4_ = auVar24._20_4_ * auVar24._20_4_ * 0.0;
      auVar33._24_4_ = auVar24._24_4_ * auVar24._24_4_ * 0.0;
      auVar33._28_4_ = auVar24._28_4_;
      auVar34._4_4_ = auVar127._4_4_ * auVar127._4_4_;
      auVar34._0_4_ = auVar127._0_4_ * auVar127._0_4_;
      auVar34._8_4_ = auVar127._8_4_ * auVar127._8_4_;
      auVar34._12_4_ = auVar127._12_4_ * auVar127._12_4_;
      auVar34._16_4_ = auVar127._16_4_ * auVar127._16_4_;
      auVar34._20_4_ = auVar127._20_4_ * auVar127._20_4_;
      auVar34._24_4_ = auVar127._24_4_ * auVar127._24_4_;
      auVar34._28_4_ = auVar127._28_4_;
      auVar24 = vcmpps_avx(auVar34,auVar33,2);
      fVar137 = auVar14._0_4_ * 4.7683716e-07;
      auVar119._0_4_ = (float)iVar104;
      local_520._4_12_ = auVar178._4_12_;
      local_520._0_4_ = auVar119._0_4_;
      local_520._16_16_ = auVar115._16_16_;
      auVar119._4_4_ = auVar119._0_4_;
      auVar119._8_4_ = auVar119._0_4_;
      auVar119._12_4_ = auVar119._0_4_;
      auVar119._16_4_ = auVar119._0_4_;
      auVar119._20_4_ = auVar119._0_4_;
      auVar119._24_4_ = auVar119._0_4_;
      auVar119._28_4_ = auVar119._0_4_;
      auVar115 = vcmpps_avx(_DAT_01faff40,auVar119,1);
      auVar16 = vpermilps_avx(auVar157,0xaa);
      uVar111 = auVar16._0_8_;
      local_5a0._8_8_ = uVar111;
      local_5a0._0_8_ = uVar111;
      local_5a0._16_8_ = uVar111;
      local_5a0._24_8_ = uVar111;
      auVar112 = vpermilps_avx(auVar177,0xaa);
      uVar111 = auVar112._0_8_;
      local_580._8_8_ = uVar111;
      local_580._0_8_ = uVar111;
      local_580._16_8_ = uVar111;
      local_580._24_8_ = uVar111;
      auVar14 = vshufps_avx(auVar178,auVar178,0xaa);
      uVar111 = auVar14._0_8_;
      local_3e0._8_8_ = uVar111;
      local_3e0._0_8_ = uVar111;
      local_3e0._16_8_ = uVar111;
      local_3e0._24_8_ = uVar111;
      auVar14 = vshufps_avx(auVar186,auVar186,0xaa);
      uVar111 = auVar14._0_8_;
      register0x00001508 = uVar111;
      local_6e0 = uVar111;
      register0x00001510 = uVar111;
      register0x00001518 = uVar111;
      auVar127 = auVar115 & auVar24;
      uVar103 = *(uint *)(ray + k * 4 + 0x60);
      local_620._0_16_ = ZEXT416(uVar103);
      if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar127 >> 0x7f,0) == '\0') &&
            (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar127 >> 0xbf,0) == '\0') &&
          (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar127[0x1f]) {
        auVar201 = ZEXT3264(auVar156);
LAB_017f6e64:
        auVar208 = ZEXT3264(_local_6e0);
        bVar102 = false;
      }
      else {
        _local_4a0 = vandps_avx(auVar24,auVar115);
        local_500._0_4_ = auVar99._0_4_;
        local_500._4_4_ = auVar99._4_4_;
        fStack_4f8 = auVar99._8_4_;
        fStack_4f4 = auVar99._12_4_;
        fStack_4f0 = auVar99._16_4_;
        fStack_4ec = auVar99._20_4_;
        fStack_4e8 = auVar99._24_4_;
        fVar203 = auVar14._0_4_;
        fVar209 = auVar14._4_4_;
        auVar35._4_4_ = fVar209 * (float)local_500._4_4_;
        auVar35._0_4_ = fVar203 * (float)local_500._0_4_;
        auVar35._8_4_ = fVar203 * fStack_4f8;
        auVar35._12_4_ = fVar209 * fStack_4f4;
        auVar35._16_4_ = fVar203 * fStack_4f0;
        auVar35._20_4_ = fVar209 * fStack_4ec;
        auVar35._24_4_ = fVar203 * fStack_4e8;
        auVar35._28_4_ = local_4a0._28_4_;
        auVar14 = vfmadd213ps_fma(auVar22,local_3e0,auVar35);
        auVar14 = vfmadd213ps_fma(auVar23,local_580,ZEXT1632(auVar14));
        auVar14 = vfmadd213ps_fma(auVar166,local_5a0,ZEXT1632(auVar14));
        local_5e0._0_4_ = auVar98._0_4_;
        local_5e0._4_4_ = auVar98._4_4_;
        fStack_5d8 = auVar98._8_4_;
        fStack_5d4 = auVar98._12_4_;
        fStack_5d0 = auVar98._16_4_;
        fStack_5cc = auVar98._20_4_;
        fStack_5c8 = auVar98._24_4_;
        auVar120._0_4_ = fVar203 * (float)local_5e0._0_4_;
        auVar120._4_4_ = fVar209 * (float)local_5e0._4_4_;
        auVar120._8_4_ = fVar203 * fStack_5d8;
        auVar120._12_4_ = fVar209 * fStack_5d4;
        auVar120._16_4_ = fVar203 * fStack_5d0;
        auVar120._20_4_ = fVar209 * fStack_5cc;
        auVar120._24_4_ = fVar203 * fStack_5c8;
        auVar120._28_4_ = 0;
        auVar157 = vfmadd213ps_fma(auVar170,local_3e0,auVar120);
        auVar157 = vfmadd213ps_fma(auVar124,local_580,ZEXT1632(auVar157));
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1210);
        auVar124 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1694);
        auVar170 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1b18);
        fVar136 = *(float *)(catmullrom_basis0 + lVar25 + 0x1f9c);
        fVar171 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fa0);
        fVar172 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fa4);
        fVar173 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fa8);
        fVar174 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fac);
        fVar175 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fb0);
        fVar176 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fb4);
        auVar165._0_4_ = fVar136 * fVar202;
        auVar165._4_4_ = fVar171 * fVar202;
        auVar165._8_4_ = fVar172 * fVar202;
        auVar165._12_4_ = fVar173 * fVar202;
        auVar165._16_4_ = fVar174 * fVar202;
        auVar165._20_4_ = fVar175 * fVar202;
        auVar165._24_4_ = fVar176 * fVar202;
        auVar165._28_4_ = 0;
        auVar36._4_4_ = fVar211 * fVar171;
        auVar36._0_4_ = fVar210 * fVar136;
        auVar36._8_4_ = fVar210 * fVar172;
        auVar36._12_4_ = fVar211 * fVar173;
        auVar36._16_4_ = fVar210 * fVar174;
        auVar36._20_4_ = fVar211 * fVar175;
        auVar36._24_4_ = fVar210 * fVar176;
        auVar36._28_4_ = auVar112._4_4_;
        auVar197._0_4_ = fVar203 * fVar136;
        auVar197._4_4_ = fVar209 * fVar171;
        auVar197._8_4_ = fVar203 * fVar172;
        auVar197._12_4_ = fVar209 * fVar173;
        auVar197._16_4_ = fVar203 * fVar174;
        auVar197._20_4_ = fVar209 * fVar175;
        auVar197._24_4_ = fVar203 * fVar176;
        auVar197._28_4_ = 0;
        auVar112 = vfmadd231ps_fma(auVar165,auVar170,auVar144);
        auVar177 = vfmadd231ps_fma(auVar36,auVar170,auVar164);
        auVar178 = vfmadd231ps_fma(auVar197,local_3e0,auVar170);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar124,auVar224);
        auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar124,auVar153);
        auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar124,local_580);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar115,auVar214);
        auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar115,local_600);
        auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),local_5a0,auVar115);
        fVar136 = *(float *)(catmullrom_basis1 + lVar25 + 0x1f9c);
        fVar171 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fa0);
        fVar172 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fa4);
        fVar173 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fa8);
        fVar174 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fac);
        fVar175 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fb0);
        fVar176 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fb4);
        auVar37._4_4_ = fVar171 * fVar202;
        auVar37._0_4_ = fVar136 * fVar202;
        auVar37._8_4_ = fVar172 * fVar202;
        auVar37._12_4_ = fVar173 * fVar202;
        auVar37._16_4_ = fVar174 * fVar202;
        auVar37._20_4_ = fVar175 * fVar202;
        auVar37._24_4_ = fVar176 * fVar202;
        auVar37._28_4_ = auVar115._28_4_;
        auVar38._4_4_ = fVar211 * fVar171;
        auVar38._0_4_ = fVar210 * fVar136;
        auVar38._8_4_ = fVar210 * fVar172;
        auVar38._12_4_ = fVar211 * fVar173;
        auVar38._16_4_ = fVar210 * fVar174;
        auVar38._20_4_ = fVar211 * fVar175;
        auVar38._24_4_ = fVar210 * fVar176;
        auVar38._28_4_ = fVar209;
        auVar39._4_4_ = fVar209 * fVar171;
        auVar39._0_4_ = fVar203 * fVar136;
        auVar39._8_4_ = fVar203 * fVar172;
        auVar39._12_4_ = fVar209 * fVar173;
        auVar39._16_4_ = fVar203 * fVar174;
        auVar39._20_4_ = fVar209 * fVar175;
        auVar39._24_4_ = fVar203 * fVar176;
        auVar39._28_4_ = auVar16._4_4_;
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1b18);
        auVar16 = vfmadd231ps_fma(auVar37,auVar115,auVar144);
        auVar186 = vfmadd231ps_fma(auVar38,auVar115,auVar164);
        auVar27 = vfmadd231ps_fma(auVar39,auVar115,local_3e0);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1694);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar115,auVar224);
        auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar115,auVar153);
        auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar115,local_580);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1210);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar115,auVar214);
        auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar115,local_600);
        auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),local_5a0,auVar115);
        auVar115 = vandps_avx(local_400,ZEXT1632(auVar112));
        auVar124 = vandps_avx(ZEXT1632(auVar177),local_400);
        auVar124 = vmaxps_avx(auVar115,auVar124);
        auVar115 = vandps_avx(ZEXT1632(auVar178),local_400);
        auVar115 = vmaxps_avx(auVar124,auVar115);
        auVar129._4_4_ = fVar137;
        auVar129._0_4_ = fVar137;
        auVar129._8_4_ = fVar137;
        auVar129._12_4_ = fVar137;
        auVar129._16_4_ = fVar137;
        auVar129._20_4_ = fVar137;
        auVar129._24_4_ = fVar137;
        auVar129._28_4_ = fVar137;
        auVar115 = vcmpps_avx(auVar115,auVar129,1);
        auVar170 = vblendvps_avx(ZEXT1632(auVar112),auVar126,auVar115);
        auVar22 = vblendvps_avx(ZEXT1632(auVar177),auVar192,auVar115);
        auVar115 = vandps_avx(ZEXT1632(auVar16),local_400);
        auVar124 = vandps_avx(ZEXT1632(auVar186),local_400);
        auVar124 = vmaxps_avx(auVar115,auVar124);
        auVar115 = vandps_avx(ZEXT1632(auVar27),local_400);
        auVar115 = vmaxps_avx(auVar124,auVar115);
        auVar124 = vcmpps_avx(auVar115,auVar129,1);
        auVar115 = vblendvps_avx(ZEXT1632(auVar16),auVar126,auVar124);
        auVar124 = vblendvps_avx(ZEXT1632(auVar186),auVar192,auVar124);
        auVar16 = vfmadd213ps_fma(auVar150,local_5a0,ZEXT1632(auVar157));
        auVar112 = vfmadd213ps_fma(auVar170,auVar170,ZEXT832(0) << 0x20);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar22,auVar22);
        auVar150 = vrsqrtps_avx(ZEXT1632(auVar112));
        fVar136 = auVar150._0_4_;
        fVar171 = auVar150._4_4_;
        fVar172 = auVar150._8_4_;
        fVar173 = auVar150._12_4_;
        fVar174 = auVar150._16_4_;
        fVar175 = auVar150._20_4_;
        fVar176 = auVar150._24_4_;
        auVar40._4_4_ = fVar171 * fVar171 * fVar171 * auVar112._4_4_ * -0.5;
        auVar40._0_4_ = fVar136 * fVar136 * fVar136 * auVar112._0_4_ * -0.5;
        auVar40._8_4_ = fVar172 * fVar172 * fVar172 * auVar112._8_4_ * -0.5;
        auVar40._12_4_ = fVar173 * fVar173 * fVar173 * auVar112._12_4_ * -0.5;
        auVar40._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
        auVar40._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar40._24_4_ = fVar176 * fVar176 * fVar176 * -0.0;
        auVar40._28_4_ = 0;
        auVar215._8_4_ = 0x3fc00000;
        auVar215._0_8_ = 0x3fc000003fc00000;
        auVar215._12_4_ = 0x3fc00000;
        auVar215._16_4_ = 0x3fc00000;
        auVar215._20_4_ = 0x3fc00000;
        auVar215._24_4_ = 0x3fc00000;
        auVar215._28_4_ = 0x3fc00000;
        auVar112 = vfmadd231ps_fma(auVar40,auVar215,auVar150);
        fVar136 = auVar112._0_4_;
        fVar171 = auVar112._4_4_;
        auVar41._4_4_ = auVar22._4_4_ * fVar171;
        auVar41._0_4_ = auVar22._0_4_ * fVar136;
        fVar172 = auVar112._8_4_;
        auVar41._8_4_ = auVar22._8_4_ * fVar172;
        fVar173 = auVar112._12_4_;
        auVar41._12_4_ = auVar22._12_4_ * fVar173;
        auVar41._16_4_ = auVar22._16_4_ * 0.0;
        auVar41._20_4_ = auVar22._20_4_ * 0.0;
        auVar41._24_4_ = auVar22._24_4_ * 0.0;
        auVar41._28_4_ = auVar150._28_4_;
        auVar42._4_4_ = -auVar170._4_4_ * fVar171;
        auVar42._0_4_ = -auVar170._0_4_ * fVar136;
        auVar42._8_4_ = -auVar170._8_4_ * fVar172;
        auVar42._12_4_ = -auVar170._12_4_ * fVar173;
        auVar42._16_4_ = -auVar170._16_4_ * 0.0;
        auVar42._20_4_ = -auVar170._20_4_ * 0.0;
        auVar42._24_4_ = -auVar170._24_4_ * 0.0;
        auVar42._28_4_ = auVar170._28_4_ ^ 0x80000000;
        auVar112 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar124,auVar124);
        auVar170 = vrsqrtps_avx(ZEXT1632(auVar112));
        auVar150 = ZEXT1632(CONCAT412(fVar173 * 0.0,
                                      CONCAT48(fVar172 * 0.0,CONCAT44(fVar171 * 0.0,fVar136 * 0.0)))
                           );
        fVar136 = auVar170._0_4_;
        fVar171 = auVar170._4_4_;
        fVar172 = auVar170._8_4_;
        fVar173 = auVar170._12_4_;
        fVar174 = auVar170._16_4_;
        fVar175 = auVar170._20_4_;
        fVar176 = auVar170._24_4_;
        auVar43._4_4_ = fVar171 * fVar171 * auVar112._4_4_ * -0.5 * fVar171;
        auVar43._0_4_ = fVar136 * fVar136 * auVar112._0_4_ * -0.5 * fVar136;
        auVar43._8_4_ = fVar172 * fVar172 * auVar112._8_4_ * -0.5 * fVar172;
        auVar43._12_4_ = fVar173 * fVar173 * auVar112._12_4_ * -0.5 * fVar173;
        auVar43._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
        auVar43._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar43._24_4_ = fVar176 * fVar176 * fVar176 * -0.0;
        auVar43._28_4_ = 0xbf000000;
        auVar112 = vfmadd231ps_fma(auVar43,auVar215,auVar170);
        fVar136 = auVar112._0_4_;
        fVar171 = auVar112._4_4_;
        auVar44._4_4_ = fVar171 * auVar124._4_4_;
        auVar44._0_4_ = fVar136 * auVar124._0_4_;
        fVar172 = auVar112._8_4_;
        auVar44._8_4_ = fVar172 * auVar124._8_4_;
        fVar173 = auVar112._12_4_;
        auVar44._12_4_ = fVar173 * auVar124._12_4_;
        auVar44._16_4_ = auVar124._16_4_ * 0.0;
        auVar44._20_4_ = auVar124._20_4_ * 0.0;
        auVar44._24_4_ = auVar124._24_4_ * 0.0;
        auVar44._28_4_ = 0;
        auVar45._4_4_ = fVar171 * -auVar115._4_4_;
        auVar45._0_4_ = fVar136 * -auVar115._0_4_;
        auVar45._8_4_ = fVar172 * -auVar115._8_4_;
        auVar45._12_4_ = fVar173 * -auVar115._12_4_;
        auVar45._16_4_ = -auVar115._16_4_ * 0.0;
        auVar45._20_4_ = -auVar115._20_4_ * 0.0;
        auVar45._24_4_ = -auVar115._24_4_ * 0.0;
        auVar45._28_4_ = 0;
        auVar46._28_4_ = auVar170._28_4_;
        auVar46._0_28_ =
             ZEXT1628(CONCAT412(fVar173 * 0.0,
                                CONCAT48(fVar172 * 0.0,CONCAT44(fVar171 * 0.0,fVar136 * 0.0))));
        auVar112 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar185),local_5c0);
        auVar115 = ZEXT1632(auVar185);
        auVar157 = vfmadd213ps_fma(auVar42,auVar115,auVar117);
        auVar177 = vfmadd213ps_fma(auVar150,auVar115,ZEXT1632(auVar16));
        auVar27 = vfnmadd213ps_fma(auVar41,auVar115,local_5c0);
        auVar178 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar26),local_460);
        auVar28 = vfnmadd213ps_fma(auVar42,auVar115,auVar117);
        auVar115 = ZEXT1632(auVar26);
        auVar186 = vfmadd213ps_fma(auVar45,auVar115,local_480);
        auVar181 = ZEXT1632(auVar185);
        auVar200 = vfnmadd231ps_fma(ZEXT1632(auVar16),auVar181,auVar150);
        auVar16 = vfmadd213ps_fma(auVar46,auVar115,ZEXT1632(auVar14));
        auVar187 = vfnmadd213ps_fma(auVar44,auVar115,local_460);
        auVar196 = vfnmadd213ps_fma(auVar45,auVar115,local_480);
        auVar204 = vfnmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar26),auVar46);
        auVar115 = vsubps_avx(ZEXT1632(auVar186),ZEXT1632(auVar28));
        auVar124 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar200));
        auVar145._0_4_ = auVar200._0_4_ * auVar115._0_4_;
        auVar145._4_4_ = auVar200._4_4_ * auVar115._4_4_;
        auVar145._8_4_ = auVar200._8_4_ * auVar115._8_4_;
        auVar145._12_4_ = auVar200._12_4_ * auVar115._12_4_;
        auVar145._16_4_ = auVar115._16_4_ * 0.0;
        auVar145._20_4_ = auVar115._20_4_ * 0.0;
        auVar145._24_4_ = auVar115._24_4_ * 0.0;
        auVar145._28_4_ = 0;
        auVar185 = vfmsub231ps_fma(auVar145,ZEXT1632(auVar28),auVar124);
        auVar47._4_4_ = auVar124._4_4_ * auVar27._4_4_;
        auVar47._0_4_ = auVar124._0_4_ * auVar27._0_4_;
        auVar47._8_4_ = auVar124._8_4_ * auVar27._8_4_;
        auVar47._12_4_ = auVar124._12_4_ * auVar27._12_4_;
        auVar47._16_4_ = auVar124._16_4_ * 0.0;
        auVar47._20_4_ = auVar124._20_4_ * 0.0;
        auVar47._24_4_ = auVar124._24_4_ * 0.0;
        auVar47._28_4_ = auVar124._28_4_;
        auVar124 = vsubps_avx(ZEXT1632(auVar178),ZEXT1632(auVar27));
        auVar14 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar200),auVar124);
        auVar48._4_4_ = auVar28._4_4_ * auVar124._4_4_;
        auVar48._0_4_ = auVar28._0_4_ * auVar124._0_4_;
        auVar48._8_4_ = auVar28._8_4_ * auVar124._8_4_;
        auVar48._12_4_ = auVar28._12_4_ * auVar124._12_4_;
        auVar48._16_4_ = auVar124._16_4_ * 0.0;
        auVar48._20_4_ = auVar124._20_4_ * 0.0;
        auVar48._24_4_ = auVar124._24_4_ * 0.0;
        auVar48._28_4_ = auVar124._28_4_;
        auVar166 = ZEXT1632(auVar27);
        auVar27 = vfmsub231ps_fma(auVar48,auVar166,auVar115);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar27),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar185));
        auVar127 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
        auVar115 = vblendvps_avx(ZEXT1632(auVar187),ZEXT1632(auVar112),auVar127);
        auVar124 = vblendvps_avx(ZEXT1632(auVar196),ZEXT1632(auVar157),auVar127);
        auVar170 = vblendvps_avx(ZEXT1632(auVar204),ZEXT1632(auVar177),auVar127);
        auVar150 = vblendvps_avx(auVar166,ZEXT1632(auVar178),auVar127);
        auVar22 = vblendvps_avx(ZEXT1632(auVar28),ZEXT1632(auVar186),auVar127);
        auVar23 = vblendvps_avx(ZEXT1632(auVar200),ZEXT1632(auVar16),auVar127);
        auVar166 = vblendvps_avx(ZEXT1632(auVar178),auVar166,auVar127);
        auVar24 = vblendvps_avx(ZEXT1632(auVar186),ZEXT1632(auVar28),auVar127);
        auVar14 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
        auVar192 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar200),auVar127);
        auVar117 = vsubps_avx(auVar166,auVar115);
        auVar143 = vsubps_avx(auVar24,auVar124);
        auVar163 = vsubps_avx(auVar192,auVar170);
        auVar188 = vsubps_avx(auVar115,auVar150);
        auVar189 = vsubps_avx(auVar124,auVar22);
        auVar191 = vsubps_avx(auVar170,auVar23);
        auVar49._4_4_ = auVar163._4_4_ * auVar115._4_4_;
        auVar49._0_4_ = auVar163._0_4_ * auVar115._0_4_;
        auVar49._8_4_ = auVar163._8_4_ * auVar115._8_4_;
        auVar49._12_4_ = auVar163._12_4_ * auVar115._12_4_;
        auVar49._16_4_ = auVar163._16_4_ * auVar115._16_4_;
        auVar49._20_4_ = auVar163._20_4_ * auVar115._20_4_;
        auVar49._24_4_ = auVar163._24_4_ * auVar115._24_4_;
        auVar49._28_4_ = auVar192._28_4_;
        auVar16 = vfmsub231ps_fma(auVar49,auVar170,auVar117);
        auVar50._4_4_ = auVar124._4_4_ * auVar117._4_4_;
        auVar50._0_4_ = auVar124._0_4_ * auVar117._0_4_;
        auVar50._8_4_ = auVar124._8_4_ * auVar117._8_4_;
        auVar50._12_4_ = auVar124._12_4_ * auVar117._12_4_;
        auVar50._16_4_ = auVar124._16_4_ * auVar117._16_4_;
        auVar50._20_4_ = auVar124._20_4_ * auVar117._20_4_;
        auVar50._24_4_ = auVar124._24_4_ * auVar117._24_4_;
        auVar50._28_4_ = auVar166._28_4_;
        auVar112 = vfmsub231ps_fma(auVar50,auVar115,auVar143);
        auVar195 = ZEXT864(0) << 0x20;
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar112),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar121._0_4_ = auVar143._0_4_ * auVar170._0_4_;
        auVar121._4_4_ = auVar143._4_4_ * auVar170._4_4_;
        auVar121._8_4_ = auVar143._8_4_ * auVar170._8_4_;
        auVar121._12_4_ = auVar143._12_4_ * auVar170._12_4_;
        auVar121._16_4_ = auVar143._16_4_ * auVar170._16_4_;
        auVar121._20_4_ = auVar143._20_4_ * auVar170._20_4_;
        auVar121._24_4_ = auVar143._24_4_ * auVar170._24_4_;
        auVar121._28_4_ = 0;
        auVar112 = vfmsub231ps_fma(auVar121,auVar124,auVar163);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar112));
        auVar122._0_4_ = auVar191._0_4_ * auVar150._0_4_;
        auVar122._4_4_ = auVar191._4_4_ * auVar150._4_4_;
        auVar122._8_4_ = auVar191._8_4_ * auVar150._8_4_;
        auVar122._12_4_ = auVar191._12_4_ * auVar150._12_4_;
        auVar122._16_4_ = auVar191._16_4_ * auVar150._16_4_;
        auVar122._20_4_ = auVar191._20_4_ * auVar150._20_4_;
        auVar122._24_4_ = auVar191._24_4_ * auVar150._24_4_;
        auVar122._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar122,auVar188,auVar23);
        auVar51._4_4_ = auVar189._4_4_ * auVar23._4_4_;
        auVar51._0_4_ = auVar189._0_4_ * auVar23._0_4_;
        auVar51._8_4_ = auVar189._8_4_ * auVar23._8_4_;
        auVar51._12_4_ = auVar189._12_4_ * auVar23._12_4_;
        auVar51._16_4_ = auVar189._16_4_ * auVar23._16_4_;
        auVar51._20_4_ = auVar189._20_4_ * auVar23._20_4_;
        auVar51._24_4_ = auVar189._24_4_ * auVar23._24_4_;
        auVar51._28_4_ = auVar23._28_4_;
        auVar185 = vfmsub231ps_fma(auVar51,auVar22,auVar191);
        auVar52._4_4_ = auVar188._4_4_ * auVar22._4_4_;
        auVar52._0_4_ = auVar188._0_4_ * auVar22._0_4_;
        auVar52._8_4_ = auVar188._8_4_ * auVar22._8_4_;
        auVar52._12_4_ = auVar188._12_4_ * auVar22._12_4_;
        auVar52._16_4_ = auVar188._16_4_ * auVar22._16_4_;
        auVar52._20_4_ = auVar188._20_4_ * auVar22._20_4_;
        auVar52._24_4_ = auVar188._24_4_ * auVar22._24_4_;
        auVar52._28_4_ = auVar24._28_4_;
        auVar157 = vfmsub231ps_fma(auVar52,auVar189,auVar150);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar157),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar185 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar185));
        auVar150 = vmaxps_avx(ZEXT1632(auVar112),ZEXT1632(auVar185));
        auVar150 = vcmpps_avx(auVar150,ZEXT832(0) << 0x20,2);
        auVar16 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
        auVar14 = vpand_avx(auVar16,auVar14);
        auVar150 = vpmovsxwd_avx2(auVar14);
        if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar150 >> 0x7f,0) == '\0') &&
              (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar150 >> 0xbf,0) == '\0') &&
            (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar150[0x1f]) {
LAB_017f8331:
          auVar135 = ZEXT3264(CONCAT824(uStack_628,
                                        CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
          auVar201 = ZEXT3264(auVar156);
        }
        else {
          auVar53._4_4_ = auVar143._4_4_ * auVar191._4_4_;
          auVar53._0_4_ = auVar143._0_4_ * auVar191._0_4_;
          auVar53._8_4_ = auVar143._8_4_ * auVar191._8_4_;
          auVar53._12_4_ = auVar143._12_4_ * auVar191._12_4_;
          auVar53._16_4_ = auVar143._16_4_ * auVar191._16_4_;
          auVar53._20_4_ = auVar143._20_4_ * auVar191._20_4_;
          auVar53._24_4_ = auVar143._24_4_ * auVar191._24_4_;
          auVar53._28_4_ = auVar150._28_4_;
          auVar178 = vfmsub231ps_fma(auVar53,auVar189,auVar163);
          auVar130._0_4_ = auVar163._0_4_ * auVar188._0_4_;
          auVar130._4_4_ = auVar163._4_4_ * auVar188._4_4_;
          auVar130._8_4_ = auVar163._8_4_ * auVar188._8_4_;
          auVar130._12_4_ = auVar163._12_4_ * auVar188._12_4_;
          auVar130._16_4_ = auVar163._16_4_ * auVar188._16_4_;
          auVar130._20_4_ = auVar163._20_4_ * auVar188._20_4_;
          auVar130._24_4_ = auVar163._24_4_ * auVar188._24_4_;
          auVar130._28_4_ = 0;
          auVar177 = vfmsub231ps_fma(auVar130,auVar117,auVar191);
          auVar54._4_4_ = auVar189._4_4_ * auVar117._4_4_;
          auVar54._0_4_ = auVar189._0_4_ * auVar117._0_4_;
          auVar54._8_4_ = auVar189._8_4_ * auVar117._8_4_;
          auVar54._12_4_ = auVar189._12_4_ * auVar117._12_4_;
          auVar54._16_4_ = auVar189._16_4_ * auVar117._16_4_;
          auVar54._20_4_ = auVar189._20_4_ * auVar117._20_4_;
          auVar54._24_4_ = auVar189._24_4_ * auVar117._24_4_;
          auVar54._28_4_ = auVar22._28_4_;
          auVar186 = vfmsub231ps_fma(auVar54,auVar188,auVar143);
          auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar177),ZEXT1632(auVar186));
          auVar157 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar178),_DAT_01faff00);
          auVar150 = vrcpps_avx(ZEXT1632(auVar157));
          auVar198._8_4_ = 0x3f800000;
          auVar198._0_8_ = 0x3f8000003f800000;
          auVar198._12_4_ = 0x3f800000;
          auVar198._16_4_ = 0x3f800000;
          auVar198._20_4_ = 0x3f800000;
          auVar198._24_4_ = 0x3f800000;
          auVar198._28_4_ = 0x3f800000;
          auVar16 = vfnmadd213ps_fma(auVar150,ZEXT1632(auVar157),auVar198);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar150,auVar150);
          auVar182._0_4_ = auVar186._0_4_ * auVar170._0_4_;
          auVar182._4_4_ = auVar186._4_4_ * auVar170._4_4_;
          auVar182._8_4_ = auVar186._8_4_ * auVar170._8_4_;
          auVar182._12_4_ = auVar186._12_4_ * auVar170._12_4_;
          auVar182._16_4_ = auVar170._16_4_ * 0.0;
          auVar182._20_4_ = auVar170._20_4_ * 0.0;
          auVar182._24_4_ = auVar170._24_4_ * 0.0;
          auVar182._28_4_ = 0;
          auVar177 = vfmadd231ps_fma(auVar182,auVar124,ZEXT1632(auVar177));
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),ZEXT1632(auVar178),auVar115);
          fVar136 = auVar16._0_4_;
          fVar171 = auVar16._4_4_;
          fVar172 = auVar16._8_4_;
          fVar173 = auVar16._12_4_;
          auVar170 = ZEXT1632(CONCAT412(fVar173 * auVar177._12_4_,
                                        CONCAT48(fVar172 * auVar177._8_4_,
                                                 CONCAT44(fVar171 * auVar177._4_4_,
                                                          fVar136 * auVar177._0_4_))));
          auVar123._4_4_ = uVar103;
          auVar123._0_4_ = uVar103;
          auVar123._8_4_ = uVar103;
          auVar123._12_4_ = uVar103;
          auVar123._16_4_ = uVar103;
          auVar123._20_4_ = uVar103;
          auVar123._24_4_ = uVar103;
          auVar123._28_4_ = uVar103;
          uVar199 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar131._4_4_ = uVar199;
          auVar131._0_4_ = uVar199;
          auVar131._8_4_ = uVar199;
          auVar131._12_4_ = uVar199;
          auVar131._16_4_ = uVar199;
          auVar131._20_4_ = uVar199;
          auVar131._24_4_ = uVar199;
          auVar131._28_4_ = uVar199;
          auVar115 = vcmpps_avx(auVar123,auVar170,2);
          auVar124 = vcmpps_avx(auVar170,auVar131,2);
          auVar115 = vandps_avx(auVar124,auVar115);
          auVar16 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
          auVar14 = vpand_avx(auVar14,auVar16);
          auVar115 = vpmovsxwd_avx2(auVar14);
          auVar195 = ZEXT864(0) << 0x20;
          if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar115 >> 0x7f,0) == '\0') &&
                (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0xbf,0) == '\0') &&
              (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar115[0x1f]) goto LAB_017f8331;
          auVar115 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar157),4);
          auVar16 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
          auVar14 = vpand_avx(auVar14,auVar16);
          auVar115 = vpmovsxwd_avx2(auVar14);
          auVar135 = ZEXT3264(CONCAT824(uStack_628,
                                        CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
          auVar201 = ZEXT3264(auVar156);
          if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar115 >> 0x7f,0) != '\0') ||
                (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar115 >> 0xbf,0) != '\0') ||
              (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar115[0x1f] < '\0') {
            auVar124 = ZEXT1632(CONCAT412(fVar173 * auVar112._12_4_,
                                          CONCAT48(fVar172 * auVar112._8_4_,
                                                   CONCAT44(fVar171 * auVar112._4_4_,
                                                            fVar136 * auVar112._0_4_))));
            auVar55._28_4_ = local_560._28_4_;
            auVar55._0_28_ =
                 ZEXT1628(CONCAT412(fVar173 * auVar185._12_4_,
                                    CONCAT48(fVar172 * auVar185._8_4_,
                                             CONCAT44(fVar171 * auVar185._4_4_,
                                                      fVar136 * auVar185._0_4_))));
            auVar162._8_4_ = 0x3f800000;
            auVar162._0_8_ = 0x3f8000003f800000;
            auVar162._12_4_ = 0x3f800000;
            auVar162._16_4_ = 0x3f800000;
            auVar162._20_4_ = 0x3f800000;
            auVar162._24_4_ = 0x3f800000;
            auVar162._28_4_ = 0x3f800000;
            auVar156 = vsubps_avx(auVar162,auVar124);
            auVar156 = vblendvps_avx(auVar156,auVar124,auVar127);
            auVar201 = ZEXT3264(auVar156);
            auVar156 = vsubps_avx(auVar162,auVar55);
            local_4c0 = vblendvps_avx(auVar156,auVar55,auVar127);
            auVar135 = ZEXT3264(auVar115);
            local_560 = auVar170;
          }
        }
        auVar208 = ZEXT3264(_local_6e0);
        auVar115 = auVar135._0_32_;
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0x7f,0) == '\0') &&
              (auVar135 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar115 >> 0xbf,0) == '\0') &&
            (auVar135 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar135[0x1f]) goto LAB_017f6e64;
        auVar156 = vsubps_avx(ZEXT1632(auVar26),auVar181);
        auVar170 = auVar201._0_32_;
        auVar14 = vfmadd213ps_fma(auVar156,auVar170,auVar181);
        fVar136 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar156._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar136;
        auVar156._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar136;
        auVar156._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar136;
        auVar156._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar136;
        auVar156._16_4_ = fVar136 * 0.0;
        auVar156._20_4_ = fVar136 * 0.0;
        auVar156._24_4_ = fVar136 * 0.0;
        auVar156._28_4_ = 0;
        auVar156 = vcmpps_avx(local_560,auVar156,6);
        auVar124 = auVar115 & auVar156;
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar124 >> 0x7f,0) == '\0') &&
              (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar124 >> 0xbf,0) == '\0') &&
            (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar124[0x1f]) {
LAB_017f6f33:
          bVar102 = false;
        }
        else {
          auVar132._8_4_ = 0xbf800000;
          auVar132._0_8_ = 0xbf800000bf800000;
          auVar132._12_4_ = 0xbf800000;
          auVar132._16_4_ = 0xbf800000;
          auVar132._20_4_ = 0xbf800000;
          auVar132._24_4_ = 0xbf800000;
          auVar132._28_4_ = 0xbf800000;
          auVar146._8_4_ = 0x40000000;
          auVar146._0_8_ = 0x4000000040000000;
          auVar146._12_4_ = 0x40000000;
          auVar146._16_4_ = 0x40000000;
          auVar146._20_4_ = 0x40000000;
          auVar146._24_4_ = 0x40000000;
          auVar146._28_4_ = 0x40000000;
          auVar14 = vfmadd213ps_fma(local_4c0,auVar146,auVar132);
          local_3a0 = ZEXT1632(auVar14);
          local_360 = 0;
          local_4c0 = local_3a0;
          if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_017f6f33;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (bVar102 = true, pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar115 = vandps_avx(auVar156,auVar115);
            fVar136 = 1.0 / auVar119._0_4_;
            local_2e0[0] = fVar136 * (auVar201._0_4_ + 0.0);
            local_2e0[1] = fVar136 * (auVar201._4_4_ + 1.0);
            local_2e0[2] = fVar136 * (auVar201._8_4_ + 2.0);
            local_2e0[3] = fVar136 * (auVar201._12_4_ + 3.0);
            fStack_2d0 = fVar136 * (auVar201._16_4_ + 4.0);
            fStack_2cc = fVar136 * (auVar201._20_4_ + 5.0);
            fStack_2c8 = fVar136 * (auVar201._24_4_ + 6.0);
            fStack_2c4 = auVar201._28_4_ + 7.0;
            local_4c0._0_8_ = auVar14._0_8_;
            local_4c0._8_8_ = auVar14._8_8_;
            local_2c0 = local_4c0._0_8_;
            uStack_2b8 = local_4c0._8_8_;
            uStack_2b0 = 0;
            uStack_2a8 = 0;
            local_2a0 = local_560;
            uVar103 = vmovmskps_avx(auVar115);
            if (uVar103 == 0) goto LAB_017f6f33;
            uVar105 = 0;
            uVar107 = (ulong)(uVar103 & 0xff);
            for (uVar106 = uVar107; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x8000000000000000)
            {
              uVar105 = uVar105 + 1;
            }
            local_940._0_4_ = local_940._4_4_;
            local_940._8_4_ = local_940._4_4_;
            local_940._12_4_ = local_940._4_4_;
            local_940._16_4_ = local_940._4_4_;
            local_940._20_4_ = local_940._4_4_;
            local_940._24_4_ = local_940._4_4_;
            local_940._28_4_ = local_940._4_4_;
            local_6a0._0_4_ = local_6a0._4_4_;
            local_6a0._8_4_ = local_6a0._4_4_;
            local_6a0._12_4_ = local_6a0._4_4_;
            local_6a0._16_4_ = local_6a0._4_4_;
            local_6a0._20_4_ = local_6a0._4_4_;
            local_6a0._24_4_ = local_6a0._4_4_;
            local_6a0._28_4_ = local_6a0._4_4_;
            local_6c0 = ZEXT1632(CONCAT124(auVar26._4_12_,*(undefined4 *)(ray + k * 4 + 0x100)));
            _local_5e0 = auVar126;
            _local_500 = *pauVar5;
            local_3c0 = auVar170;
            local_380 = local_560;
            local_35c = iVar104;
            local_350 = uVar184;
            uStack_348 = uVar92;
            local_340 = uVar93;
            uStack_338 = uVar94;
            local_330 = uVar95;
            uStack_328 = uVar96;
            do {
              fVar136 = local_2e0[uVar105];
              auVar113._4_4_ = fVar136;
              auVar113._0_4_ = fVar136;
              auVar113._8_4_ = fVar136;
              auVar113._12_4_ = fVar136;
              local_220._16_4_ = fVar136;
              local_220._0_16_ = auVar113;
              local_220._20_4_ = fVar136;
              local_220._24_4_ = fVar136;
              local_220._28_4_ = fVar136;
              local_200 = *(undefined4 *)((long)&local_2c0 + uVar105 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar105 * 4);
              fVar171 = 1.0 - fVar136;
              auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar113,ZEXT416(0xc0a00000))
              ;
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * fVar136 * 3.0)),
                                        ZEXT416((uint)(fVar136 + fVar136)),auVar14);
              auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar113,ZEXT416(0x40000000))
              ;
              auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171 * -3.0)),
                                        ZEXT416((uint)(fVar171 + fVar171)),auVar14);
              auVar185 = vfnmadd231ss_fma(ZEXT416((uint)(fVar136 * (fVar171 + fVar171))),
                                          ZEXT416((uint)fVar171),ZEXT416((uint)fVar171));
              auVar112 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * fVar136)),auVar113,
                                         ZEXT416((uint)(fVar171 * -2.0)));
              fVar136 = auVar14._0_4_ * 0.5;
              fVar171 = auVar112._0_4_ * 0.5;
              auVar158._0_4_ = fVar171 * local_6f0;
              auVar158._4_4_ = fVar171 * fStack_6ec;
              auVar158._8_4_ = fVar171 * fStack_6e8;
              auVar158._12_4_ = fVar171 * fStack_6e4;
              auVar138._4_4_ = fVar136;
              auVar138._0_4_ = fVar136;
              auVar138._8_4_ = fVar136;
              auVar138._12_4_ = fVar136;
              auVar14 = vfmadd132ps_fma(auVar138,auVar158,auVar20);
              fVar136 = auVar16._0_4_ * 0.5;
              auVar159._4_4_ = fVar136;
              auVar159._0_4_ = fVar136;
              auVar159._8_4_ = fVar136;
              auVar159._12_4_ = fVar136;
              auVar14 = vfmadd132ps_fma(auVar159,auVar14,auVar21);
              local_770.context = context->user;
              fVar136 = auVar185._0_4_ * 0.5;
              auVar139._4_4_ = fVar136;
              auVar139._0_4_ = fVar136;
              auVar139._8_4_ = fVar136;
              auVar139._12_4_ = fVar136;
              auVar16 = vfmadd132ps_fma(auVar139,auVar14,auVar10);
              local_280 = auVar16._0_4_;
              uStack_27c = local_280;
              uStack_278 = local_280;
              uStack_274 = local_280;
              uStack_270 = local_280;
              uStack_26c = local_280;
              uStack_268 = local_280;
              uStack_264 = local_280;
              auVar14 = vmovshdup_avx(auVar16);
              local_260 = auVar14._0_8_;
              uStack_258 = local_260;
              uStack_250 = local_260;
              uStack_248 = local_260;
              auVar14 = vshufps_avx(auVar16,auVar16,0xaa);
              auVar140._0_8_ = auVar14._0_8_;
              auVar140._8_8_ = auVar140._0_8_;
              auVar147._16_8_ = auVar140._0_8_;
              auVar147._0_16_ = auVar140;
              auVar147._24_8_ = auVar140._0_8_;
              local_240 = auVar147;
              uStack_1fc = local_200;
              uStack_1f8 = local_200;
              uStack_1f4 = local_200;
              uStack_1f0 = local_200;
              uStack_1ec = local_200;
              uStack_1e8 = local_200;
              uStack_1e4 = local_200;
              local_1e0 = local_6a0._0_8_;
              uStack_1d8 = local_6a0._8_8_;
              uStack_1d0 = local_6a0._16_8_;
              uStack_1c8 = local_6a0._24_8_;
              local_1c0 = local_940;
              vpcmpeqd_avx2(local_940,local_940);
              local_1a0 = (local_770.context)->instID[0];
              uStack_19c = local_1a0;
              uStack_198 = local_1a0;
              uStack_194 = local_1a0;
              uStack_190 = local_1a0;
              uStack_18c = local_1a0;
              uStack_188 = local_1a0;
              uStack_184 = local_1a0;
              local_180 = (local_770.context)->instPrimID[0];
              uStack_17c = local_180;
              uStack_178 = local_180;
              uStack_174 = local_180;
              uStack_170 = local_180;
              uStack_16c = local_180;
              uStack_168 = local_180;
              uStack_164 = local_180;
              local_680 = local_420;
              local_770.valid = (int *)local_680;
              local_770.geometryUserPtr = pGVar18->userPtr;
              local_770.hit = (RTCHitN *)&local_280;
              local_770.N = 8;
              local_770.ray = (RTCRayN *)ray;
              if (pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar147 = ZEXT1632(auVar140);
                (*pGVar18->occlusionFilterN)(&local_770);
                auVar208 = ZEXT3264(_local_6e0);
                auVar201 = ZEXT3264(auVar170);
                auVar195 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar156 = vpcmpeqd_avx2(auVar195._0_32_,local_680);
              auVar124 = vpcmpeqd_avx2(auVar147,auVar147);
              auVar115 = auVar124 & ~auVar156;
              if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar115 >> 0x7f,0) == '\0') &&
                    (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar115 >> 0xbf,0) == '\0') &&
                  (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar115[0x1f]) {
                auVar156 = auVar156 ^ auVar124;
              }
              else {
                p_Var19 = context->args->filter;
                if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar18->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var19)(&local_770);
                  auVar208 = ZEXT3264(_local_6e0);
                  auVar201 = ZEXT3264(auVar170);
                  auVar195 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar115 = vpcmpeqd_avx2(auVar195._0_32_,local_680);
                auVar156 = vpcmpeqd_avx2(local_680,local_680);
                auVar156 = auVar115 ^ auVar156;
                auVar148._8_4_ = 0xff800000;
                auVar148._0_8_ = 0xff800000ff800000;
                auVar148._12_4_ = 0xff800000;
                auVar148._16_4_ = 0xff800000;
                auVar148._20_4_ = 0xff800000;
                auVar148._24_4_ = 0xff800000;
                auVar148._28_4_ = 0xff800000;
                auVar115 = vblendvps_avx(auVar148,*(undefined1 (*) [32])(local_770.ray + 0x100),
                                         auVar115);
                *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar115;
              }
              if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar156 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar156 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar156 >> 0x7f,0) != '\0') ||
                    (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar156 >> 0xbf,0) != '\0') ||
                  (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar156[0x1f] < '\0') {
                bVar102 = true;
                break;
              }
              *(undefined4 *)(ray + k * 4 + 0x100) = local_6c0._0_4_;
              uVar106 = uVar105 & 0x3f;
              bVar102 = false;
              uVar105 = 0;
              uVar107 = uVar107 ^ 1L << uVar106;
              for (uVar106 = uVar107; (uVar106 & 1) == 0;
                  uVar106 = uVar106 >> 1 | 0x8000000000000000) {
                uVar105 = uVar105 + 1;
              }
            } while (uVar107 != 0);
          }
        }
      }
      auVar135 = ZEXT3264(local_720);
      auVar195 = ZEXT3264(local_740);
      if (8 < iVar104) {
        local_5e0._4_4_ = iVar104;
        local_5e0._0_4_ = iVar104;
        fStack_5d8 = (float)iVar104;
        fStack_5d4 = (float)iVar104;
        fStack_5d0 = (float)iVar104;
        fStack_5cc = (float)iVar104;
        fStack_5c8 = (float)iVar104;
        iStack_5c4 = iVar104;
        local_4a0._4_4_ = fVar137;
        local_4a0._0_4_ = fVar137;
        fStack_498 = fVar137;
        fStack_494 = fVar137;
        fStack_490 = fVar137;
        fStack_48c = fVar137;
        fStack_488 = fVar137;
        fStack_484 = fVar137;
        local_120 = local_620._0_4_;
        uStack_11c = local_620._0_4_;
        uStack_118 = local_620._0_4_;
        uStack_114 = local_620._0_4_;
        uStack_110 = local_620._0_4_;
        uStack_10c = local_620._0_4_;
        uStack_108 = local_620._0_4_;
        uStack_104 = local_620._0_4_;
        local_160 = 1.0 / (float)local_520._0_4_;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        local_140 = local_940._4_4_;
        uStack_13c = local_940._4_4_;
        uStack_138 = local_940._4_4_;
        uStack_134 = local_940._4_4_;
        uStack_130 = local_940._4_4_;
        uStack_12c = local_940._4_4_;
        uStack_128 = local_940._4_4_;
        uStack_124 = local_940._4_4_;
        local_540 = CONCAT44((undefined4)local_540,(undefined4)local_540);
        uStack_538 = (undefined4)local_540;
        uStack_534 = (undefined4)local_540;
        uStack_530 = (undefined4)local_540;
        uStack_52c = (undefined4)local_540;
        uStack_528 = (undefined4)local_540;
        uStack_524 = (undefined4)local_540;
        lVar108 = 8;
        auVar115 = auVar201._0_32_;
        _local_6e0 = auVar208._0_32_;
        do {
          auVar192 = auVar195._0_32_;
          local_720 = auVar135._0_32_;
          auVar156 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar108 * 4 + lVar25);
          auVar124 = *(undefined1 (*) [32])(lVar25 + 0x21b37f0 + lVar108 * 4);
          auVar170 = *(undefined1 (*) [32])(lVar25 + 0x21b3c74 + lVar108 * 4);
          pfVar6 = (float *)(lVar25 + 0x21b40f8 + lVar108 * 4);
          fVar176 = *pfVar6;
          fVar203 = pfVar6[1];
          fVar209 = pfVar6[2];
          fVar87 = pfVar6[3];
          fVar88 = pfVar6[4];
          fVar89 = pfVar6[5];
          fVar90 = pfVar6[6];
          auVar207._0_4_ = fVar202 * fVar176;
          auVar207._4_4_ = fVar202 * fVar203;
          auVar207._8_4_ = fVar202 * fVar209;
          auVar207._12_4_ = fVar202 * fVar87;
          auVar207._16_4_ = fVar202 * fVar88;
          auVar207._20_4_ = fVar202 * fVar89;
          auVar207._28_36_ = auVar208._28_36_;
          auVar207._24_4_ = fVar202 * fVar90;
          auVar208._0_4_ = fVar210 * fVar176;
          auVar208._4_4_ = fVar211 * fVar203;
          auVar208._8_4_ = fVar210 * fVar209;
          auVar208._12_4_ = fVar211 * fVar87;
          auVar208._16_4_ = fVar210 * fVar88;
          auVar208._20_4_ = fVar211 * fVar89;
          auVar208._28_36_ = auVar135._28_36_;
          auVar208._24_4_ = fVar210 * fVar90;
          auVar20 = vfmadd231ps_fma(auVar207._0_32_,auVar170,auVar144);
          auVar21 = vfmadd231ps_fma(auVar208._0_32_,auVar170,auVar164);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar124,auVar224);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar124,auVar153);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar156,auVar214);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar156,local_600);
          auVar126 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar108 * 4 + lVar25);
          auVar150 = *(undefined1 (*) [32])(lVar25 + 0x21b5c10 + lVar108 * 4);
          auVar22 = *(undefined1 (*) [32])(lVar25 + 0x21b6094 + lVar108 * 4);
          pfVar7 = (float *)(lVar25 + 0x21b6518 + lVar108 * 4);
          fVar91 = *pfVar7;
          fVar212 = pfVar7[1];
          fVar216 = pfVar7[2];
          fVar217 = pfVar7[3];
          fVar218 = pfVar7[4];
          fVar219 = pfVar7[5];
          fVar220 = pfVar7[6];
          auVar101._4_4_ = fVar202 * fVar212;
          auVar101._0_4_ = fVar202 * fVar91;
          auVar101._8_4_ = fVar202 * fVar216;
          auVar101._12_4_ = fVar202 * fVar217;
          auVar101._16_4_ = fVar202 * fVar218;
          auVar101._20_4_ = fVar202 * fVar219;
          auVar101._24_4_ = fVar202 * fVar220;
          auVar101._28_4_ = uVar110;
          auVar56._4_4_ = fVar211 * fVar212;
          auVar56._0_4_ = fVar210 * fVar91;
          auVar56._8_4_ = fVar210 * fVar216;
          auVar56._12_4_ = fVar211 * fVar217;
          auVar56._16_4_ = fVar210 * fVar218;
          auVar56._20_4_ = fVar211 * fVar219;
          auVar56._24_4_ = fVar210 * fVar220;
          auVar56._28_4_ = fVar211;
          auVar10 = vfmadd231ps_fma(auVar101,auVar22,auVar144);
          auVar14 = vfmadd231ps_fma(auVar56,auVar22,auVar164);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar150,auVar224);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar150,auVar153);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar126,auVar214);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar126,local_600);
          local_480 = ZEXT1632(auVar10);
          local_6c0 = ZEXT1632(auVar20);
          local_5c0 = vsubps_avx(local_480,local_6c0);
          local_6a0 = ZEXT1632(auVar14);
          local_620 = ZEXT1632(auVar21);
          local_460 = vsubps_avx(local_6a0,local_620);
          auVar57._4_4_ = local_5c0._4_4_ * auVar21._4_4_;
          auVar57._0_4_ = local_5c0._0_4_ * auVar21._0_4_;
          auVar57._8_4_ = local_5c0._8_4_ * auVar21._8_4_;
          auVar57._12_4_ = local_5c0._12_4_ * auVar21._12_4_;
          auVar57._16_4_ = local_5c0._16_4_ * 0.0;
          auVar57._20_4_ = local_5c0._20_4_ * 0.0;
          auVar57._24_4_ = local_5c0._24_4_ * 0.0;
          auVar57._28_4_ = pfVar6[7];
          fVar137 = local_460._0_4_;
          auVar133._0_4_ = auVar20._0_4_ * fVar137;
          fVar136 = local_460._4_4_;
          auVar133._4_4_ = auVar20._4_4_ * fVar136;
          fVar171 = local_460._8_4_;
          auVar133._8_4_ = auVar20._8_4_ * fVar171;
          fVar172 = local_460._12_4_;
          auVar133._12_4_ = auVar20._12_4_ * fVar172;
          fVar173 = local_460._16_4_;
          auVar133._16_4_ = fVar173 * 0.0;
          fVar174 = local_460._20_4_;
          auVar133._20_4_ = fVar174 * 0.0;
          fVar175 = local_460._24_4_;
          auVar133._24_4_ = fVar175 * 0.0;
          auVar133._28_4_ = 0;
          auVar208 = ZEXT3264(auVar170);
          auVar166 = vsubps_avx(auVar57,auVar133);
          auVar58._4_4_ = local_100._4_4_ * fVar203;
          auVar58._0_4_ = (float)local_100 * fVar176;
          auVar58._8_4_ = (float)uStack_f8 * fVar209;
          auVar58._12_4_ = uStack_f8._4_4_ * fVar87;
          auVar58._16_4_ = (float)uStack_f0 * fVar88;
          auVar58._20_4_ = uStack_f0._4_4_ * fVar89;
          auVar58._24_4_ = (float)uStack_e8 * fVar90;
          auVar58._28_4_ = 0;
          auVar20 = vfmadd231ps_fma(auVar58,auVar170,local_e0);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar124,local_c0);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_a0,auVar156);
          auVar59._4_4_ = local_100._4_4_ * fVar212;
          auVar59._0_4_ = (float)local_100 * fVar91;
          auVar59._8_4_ = (float)uStack_f8 * fVar216;
          auVar59._12_4_ = uStack_f8._4_4_ * fVar217;
          auVar59._16_4_ = (float)uStack_f0 * fVar218;
          auVar59._20_4_ = uStack_f0._4_4_ * fVar219;
          auVar59._24_4_ = (float)uStack_e8 * fVar220;
          auVar59._28_4_ = uStack_e8._4_4_;
          auVar10 = vfmadd231ps_fma(auVar59,auVar22,local_e0);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar150,local_c0);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar126,local_a0);
          auVar60._4_4_ = fVar136 * fVar136;
          auVar60._0_4_ = fVar137 * fVar137;
          auVar60._8_4_ = fVar171 * fVar171;
          auVar60._12_4_ = fVar172 * fVar172;
          auVar60._16_4_ = fVar173 * fVar173;
          auVar60._20_4_ = fVar174 * fVar174;
          auVar60._24_4_ = fVar175 * fVar175;
          auVar60._28_4_ = local_a0._28_4_;
          auVar14 = vfmadd231ps_fma(auVar60,local_5c0,local_5c0);
          _local_500 = ZEXT1632(auVar20);
          auVar127 = ZEXT1632(auVar10);
          auVar23 = vmaxps_avx(_local_500,auVar127);
          auVar193._0_4_ = auVar23._0_4_ * auVar23._0_4_ * auVar14._0_4_;
          auVar193._4_4_ = auVar23._4_4_ * auVar23._4_4_ * auVar14._4_4_;
          auVar193._8_4_ = auVar23._8_4_ * auVar23._8_4_ * auVar14._8_4_;
          auVar193._12_4_ = auVar23._12_4_ * auVar23._12_4_ * auVar14._12_4_;
          auVar193._16_4_ = auVar23._16_4_ * auVar23._16_4_ * 0.0;
          auVar193._20_4_ = auVar23._20_4_ * auVar23._20_4_ * 0.0;
          auVar193._24_4_ = auVar23._24_4_ * auVar23._24_4_ * 0.0;
          auVar193._28_4_ = 0;
          auVar61._4_4_ = auVar166._4_4_ * auVar166._4_4_;
          auVar61._0_4_ = auVar166._0_4_ * auVar166._0_4_;
          auVar61._8_4_ = auVar166._8_4_ * auVar166._8_4_;
          auVar61._12_4_ = auVar166._12_4_ * auVar166._12_4_;
          auVar61._16_4_ = auVar166._16_4_ * auVar166._16_4_;
          auVar61._20_4_ = auVar166._20_4_ * auVar166._20_4_;
          auVar61._24_4_ = auVar166._24_4_ * auVar166._24_4_;
          auVar61._28_4_ = auVar166._28_4_;
          auVar23 = vcmpps_avx(auVar61,auVar193,2);
          local_360 = (int)lVar108;
          auVar194._4_4_ = local_360;
          auVar194._0_4_ = local_360;
          auVar194._8_4_ = local_360;
          auVar194._12_4_ = local_360;
          auVar194._16_4_ = local_360;
          auVar194._20_4_ = local_360;
          auVar194._24_4_ = local_360;
          auVar194._28_4_ = local_360;
          auVar166 = vpor_avx2(auVar194,_DAT_01fe9900);
          auVar24 = vpcmpgtd_avx2(_local_5e0,auVar166);
          auVar166 = auVar24 & auVar23;
          if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar166 >> 0x7f,0) == '\0') &&
                (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar166 >> 0xbf,0) == '\0') &&
              (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar166[0x1f]) {
            auVar195 = ZEXT3264(auVar192);
LAB_017f7cd3:
            auVar135 = ZEXT3264(local_720);
          }
          else {
            local_520 = vandps_avx(auVar24,auVar23);
            auVar62._4_4_ = fVar212 * (float)local_6e0._4_4_;
            auVar62._0_4_ = fVar91 * (float)local_6e0._0_4_;
            auVar62._8_4_ = fVar216 * fStack_6d8;
            auVar62._12_4_ = fVar217 * fStack_6d4;
            auVar62._16_4_ = fVar218 * fStack_6d0;
            auVar62._20_4_ = fVar219 * fStack_6cc;
            auVar62._24_4_ = fVar220 * fStack_6c8;
            auVar62._28_4_ = auVar23._28_4_;
            auVar20 = vfmadd213ps_fma(auVar22,local_3e0,auVar62);
            auVar20 = vfmadd213ps_fma(auVar150,local_580,ZEXT1632(auVar20));
            auVar20 = vfmadd213ps_fma(auVar126,local_5a0,ZEXT1632(auVar20));
            auVar63._4_4_ = fVar203 * (float)local_6e0._4_4_;
            auVar63._0_4_ = fVar176 * (float)local_6e0._0_4_;
            auVar63._8_4_ = fVar209 * fStack_6d8;
            auVar63._12_4_ = fVar87 * fStack_6d4;
            auVar63._16_4_ = fVar88 * fStack_6d0;
            auVar63._20_4_ = fVar89 * fStack_6cc;
            auVar63._24_4_ = fVar90 * fStack_6c8;
            auVar63._28_4_ = auVar23._28_4_;
            auVar10 = vfmadd213ps_fma(auVar170,local_3e0,auVar63);
            auVar10 = vfmadd213ps_fma(auVar124,local_580,ZEXT1632(auVar10));
            auVar124 = *(undefined1 (*) [32])(lVar25 + 0x21b457c + lVar108 * 4);
            auVar170 = *(undefined1 (*) [32])(lVar25 + 0x21b4a00 + lVar108 * 4);
            auVar150 = *(undefined1 (*) [32])(lVar25 + 0x21b4e84 + lVar108 * 4);
            pfVar6 = (float *)(lVar25 + 0x21b5308 + lVar108 * 4);
            fVar137 = *pfVar6;
            fVar136 = pfVar6[1];
            fVar171 = pfVar6[2];
            fVar172 = pfVar6[3];
            fVar173 = pfVar6[4];
            fVar174 = pfVar6[5];
            fVar175 = pfVar6[6];
            auVar64._4_4_ = fVar202 * fVar136;
            auVar64._0_4_ = fVar202 * fVar137;
            auVar64._8_4_ = fVar202 * fVar171;
            auVar64._12_4_ = fVar202 * fVar172;
            auVar64._16_4_ = fVar202 * fVar173;
            auVar64._20_4_ = fVar202 * fVar174;
            auVar64._24_4_ = fVar202 * fVar175;
            auVar64._28_4_ = local_5c0._28_4_;
            auVar205._0_4_ = fVar137 * fVar210;
            auVar205._4_4_ = fVar136 * fVar211;
            auVar205._8_4_ = fVar171 * fVar210;
            auVar205._12_4_ = fVar172 * fVar211;
            auVar205._16_4_ = fVar173 * fVar210;
            auVar205._20_4_ = fVar174 * fVar211;
            auVar205._24_4_ = fVar175 * fVar210;
            auVar205._28_4_ = 0;
            auVar65._4_4_ = fVar136 * (float)local_6e0._4_4_;
            auVar65._0_4_ = fVar137 * (float)local_6e0._0_4_;
            auVar65._8_4_ = fVar171 * fStack_6d8;
            auVar65._12_4_ = fVar172 * fStack_6d4;
            auVar65._16_4_ = fVar173 * fStack_6d0;
            auVar65._20_4_ = fVar174 * fStack_6cc;
            auVar65._24_4_ = fVar175 * fStack_6c8;
            auVar65._28_4_ = pfVar6[7];
            auVar14 = vfmadd231ps_fma(auVar64,auVar150,auVar144);
            auVar16 = vfmadd231ps_fma(auVar205,auVar150,auVar164);
            auVar112 = vfmadd231ps_fma(auVar65,local_3e0,auVar150);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar170,auVar224);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar170,auVar153);
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),local_580,auVar170);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar124,auVar214);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar124,local_600);
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),local_5a0,auVar124);
            pfVar6 = (float *)(lVar25 + 0x21b7728 + lVar108 * 4);
            fVar137 = *pfVar6;
            fVar136 = pfVar6[1];
            fVar171 = pfVar6[2];
            fVar172 = pfVar6[3];
            fVar173 = pfVar6[4];
            fVar174 = pfVar6[5];
            fVar175 = pfVar6[6];
            auVar66._4_4_ = fVar202 * fVar136;
            auVar66._0_4_ = fVar202 * fVar137;
            auVar66._8_4_ = fVar202 * fVar171;
            auVar66._12_4_ = fVar202 * fVar172;
            auVar66._16_4_ = fVar202 * fVar173;
            auVar66._20_4_ = fVar202 * fVar174;
            auVar66._24_4_ = fVar202 * fVar175;
            auVar66._28_4_ = fVar202;
            auVar67._4_4_ = fVar211 * fVar136;
            auVar67._0_4_ = fVar210 * fVar137;
            auVar67._8_4_ = fVar210 * fVar171;
            auVar67._12_4_ = fVar211 * fVar172;
            auVar67._16_4_ = fVar210 * fVar173;
            auVar67._20_4_ = fVar211 * fVar174;
            auVar67._24_4_ = fVar210 * fVar175;
            auVar67._28_4_ = local_5a0._28_4_;
            auVar68._4_4_ = (float)local_6e0._4_4_ * fVar136;
            auVar68._0_4_ = (float)local_6e0._0_4_ * fVar137;
            auVar68._8_4_ = fStack_6d8 * fVar171;
            auVar68._12_4_ = fStack_6d4 * fVar172;
            auVar68._16_4_ = fStack_6d0 * fVar173;
            auVar68._20_4_ = fStack_6cc * fVar174;
            auVar68._24_4_ = fStack_6c8 * fVar175;
            auVar68._28_4_ = pfVar6[7];
            auVar124 = *(undefined1 (*) [32])(lVar25 + 0x21b72a4 + lVar108 * 4);
            auVar185 = vfmadd231ps_fma(auVar66,auVar124,auVar144);
            auVar157 = vfmadd231ps_fma(auVar67,auVar124,auVar164);
            auVar177 = vfmadd231ps_fma(auVar68,local_3e0,auVar124);
            auVar124 = *(undefined1 (*) [32])(lVar25 + 0x21b6e20 + lVar108 * 4);
            auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar124,auVar224);
            auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar124,auVar153);
            auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),local_580,auVar124);
            auVar124 = *(undefined1 (*) [32])(lVar25 + 0x21b699c + lVar108 * 4);
            auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar124,auVar214);
            auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar124,local_600);
            auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),local_5a0,auVar124);
            auVar124 = vandps_avx(ZEXT1632(auVar14),local_400);
            auVar170 = vandps_avx(ZEXT1632(auVar16),local_400);
            auVar170 = vmaxps_avx(auVar124,auVar170);
            auVar124 = vandps_avx(ZEXT1632(auVar112),local_400);
            auVar124 = vmaxps_avx(auVar170,auVar124);
            auVar124 = vcmpps_avx(auVar124,_local_4a0,1);
            auVar150 = vblendvps_avx(ZEXT1632(auVar14),local_5c0,auVar124);
            auVar22 = vblendvps_avx(ZEXT1632(auVar16),local_460,auVar124);
            auVar124 = vandps_avx(ZEXT1632(auVar185),local_400);
            auVar170 = vandps_avx(ZEXT1632(auVar157),local_400);
            auVar170 = vmaxps_avx(auVar124,auVar170);
            auVar124 = vandps_avx(local_400,ZEXT1632(auVar177));
            auVar124 = vmaxps_avx(auVar170,auVar124);
            auVar170 = vcmpps_avx(auVar124,_local_4a0,1);
            auVar124 = vblendvps_avx(ZEXT1632(auVar185),local_5c0,auVar170);
            auVar170 = vblendvps_avx(ZEXT1632(auVar157),local_460,auVar170);
            auVar10 = vfmadd213ps_fma(auVar156,local_5a0,ZEXT1632(auVar10));
            auVar14 = vfmadd213ps_fma(auVar150,auVar150,ZEXT832(0) << 0x20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar22,auVar22);
            auVar156 = vrsqrtps_avx(ZEXT1632(auVar14));
            fVar137 = auVar156._0_4_;
            fVar136 = auVar156._4_4_;
            fVar171 = auVar156._8_4_;
            fVar172 = auVar156._12_4_;
            fVar173 = auVar156._16_4_;
            fVar174 = auVar156._20_4_;
            fVar175 = auVar156._24_4_;
            auVar69._4_4_ = fVar136 * fVar136 * fVar136 * auVar14._4_4_ * -0.5;
            auVar69._0_4_ = fVar137 * fVar137 * fVar137 * auVar14._0_4_ * -0.5;
            auVar69._8_4_ = fVar171 * fVar171 * fVar171 * auVar14._8_4_ * -0.5;
            auVar69._12_4_ = fVar172 * fVar172 * fVar172 * auVar14._12_4_ * -0.5;
            auVar69._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
            auVar69._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
            auVar69._24_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar69._28_4_ = 0;
            auVar149._8_4_ = 0x3fc00000;
            auVar149._0_8_ = 0x3fc000003fc00000;
            auVar149._12_4_ = 0x3fc00000;
            auVar149._16_4_ = 0x3fc00000;
            auVar149._20_4_ = 0x3fc00000;
            auVar149._24_4_ = 0x3fc00000;
            auVar149._28_4_ = 0x3fc00000;
            auVar14 = vfmadd231ps_fma(auVar69,auVar149,auVar156);
            fVar137 = auVar14._0_4_;
            fVar136 = auVar14._4_4_;
            auVar70._4_4_ = auVar22._4_4_ * fVar136;
            auVar70._0_4_ = auVar22._0_4_ * fVar137;
            fVar171 = auVar14._8_4_;
            auVar70._8_4_ = auVar22._8_4_ * fVar171;
            fVar172 = auVar14._12_4_;
            auVar70._12_4_ = auVar22._12_4_ * fVar172;
            auVar70._16_4_ = auVar22._16_4_ * 0.0;
            auVar70._20_4_ = auVar22._20_4_ * 0.0;
            auVar70._24_4_ = auVar22._24_4_ * 0.0;
            auVar70._28_4_ = auVar22._28_4_;
            auVar71._4_4_ = fVar136 * -auVar150._4_4_;
            auVar71._0_4_ = fVar137 * -auVar150._0_4_;
            auVar71._8_4_ = fVar171 * -auVar150._8_4_;
            auVar71._12_4_ = fVar172 * -auVar150._12_4_;
            auVar71._16_4_ = -auVar150._16_4_ * 0.0;
            auVar71._20_4_ = -auVar150._20_4_ * 0.0;
            auVar71._24_4_ = -auVar150._24_4_ * 0.0;
            auVar71._28_4_ = auVar156._28_4_;
            auVar14 = vfmadd213ps_fma(auVar124,auVar124,ZEXT832(0) << 0x20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar170,auVar170);
            auVar156 = vrsqrtps_avx(ZEXT1632(auVar14));
            auVar72._28_4_ = auVar15._4_4_;
            auVar72._0_28_ =
                 ZEXT1628(CONCAT412(fVar172 * 0.0,
                                    CONCAT48(fVar171 * 0.0,CONCAT44(fVar136 * 0.0,fVar137 * 0.0))));
            fVar137 = auVar156._0_4_;
            fVar136 = auVar156._4_4_;
            fVar171 = auVar156._8_4_;
            fVar172 = auVar156._12_4_;
            fVar173 = auVar156._16_4_;
            fVar174 = auVar156._20_4_;
            fVar175 = auVar156._24_4_;
            auVar73._4_4_ = fVar136 * fVar136 * fVar136 * auVar14._4_4_ * -0.5;
            auVar73._0_4_ = fVar137 * fVar137 * fVar137 * auVar14._0_4_ * -0.5;
            auVar73._8_4_ = fVar171 * fVar171 * fVar171 * auVar14._8_4_ * -0.5;
            auVar73._12_4_ = fVar172 * fVar172 * fVar172 * auVar14._12_4_ * -0.5;
            auVar73._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
            auVar73._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
            auVar73._24_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar73._28_4_ = 0;
            auVar14 = vfmadd231ps_fma(auVar73,auVar149,auVar156);
            fVar137 = auVar14._0_4_;
            fVar136 = auVar14._4_4_;
            auVar74._4_4_ = auVar170._4_4_ * fVar136;
            auVar74._0_4_ = auVar170._0_4_ * fVar137;
            fVar171 = auVar14._8_4_;
            auVar74._8_4_ = auVar170._8_4_ * fVar171;
            fVar172 = auVar14._12_4_;
            auVar74._12_4_ = auVar170._12_4_ * fVar172;
            auVar74._16_4_ = auVar170._16_4_ * 0.0;
            auVar74._20_4_ = auVar170._20_4_ * 0.0;
            auVar74._24_4_ = auVar170._24_4_ * 0.0;
            auVar74._28_4_ = 0;
            auVar75._4_4_ = fVar136 * -auVar124._4_4_;
            auVar75._0_4_ = fVar137 * -auVar124._0_4_;
            auVar75._8_4_ = fVar171 * -auVar124._8_4_;
            auVar75._12_4_ = fVar172 * -auVar124._12_4_;
            auVar75._16_4_ = -auVar124._16_4_ * 0.0;
            auVar75._20_4_ = -auVar124._20_4_ * 0.0;
            auVar75._24_4_ = -auVar124._24_4_ * 0.0;
            auVar75._28_4_ = 0;
            auVar76._28_4_ = 0xbf000000;
            auVar76._0_28_ =
                 ZEXT1628(CONCAT412(fVar172 * 0.0,
                                    CONCAT48(fVar171 * 0.0,CONCAT44(fVar136 * 0.0,fVar137 * 0.0))));
            auVar14 = vfmadd213ps_fma(auVar70,_local_500,local_6c0);
            auVar16 = vfmadd213ps_fma(auVar71,_local_500,local_620);
            auVar112 = vfmadd213ps_fma(auVar72,_local_500,ZEXT1632(auVar10));
            auVar178 = vfnmadd213ps_fma(auVar70,_local_500,local_6c0);
            auVar185 = vfmadd213ps_fma(auVar74,auVar127,local_480);
            auVar186 = vfnmadd213ps_fma(auVar71,_local_500,local_620);
            auVar157 = vfmadd213ps_fma(auVar75,auVar127,local_6a0);
            auVar28 = vfnmadd231ps_fma(ZEXT1632(auVar10),_local_500,auVar72);
            auVar10 = vfmadd213ps_fma(auVar76,auVar127,ZEXT1632(auVar20));
            auVar26 = vfnmadd213ps_fma(auVar74,auVar127,local_480);
            auVar27 = vfnmadd213ps_fma(auVar75,auVar127,local_6a0);
            auVar187 = vfnmadd231ps_fma(ZEXT1632(auVar20),auVar127,auVar76);
            auVar156 = vsubps_avx(ZEXT1632(auVar157),ZEXT1632(auVar186));
            auVar124 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar28));
            auVar77._4_4_ = auVar156._4_4_ * auVar28._4_4_;
            auVar77._0_4_ = auVar156._0_4_ * auVar28._0_4_;
            auVar77._8_4_ = auVar156._8_4_ * auVar28._8_4_;
            auVar77._12_4_ = auVar156._12_4_ * auVar28._12_4_;
            auVar77._16_4_ = auVar156._16_4_ * 0.0;
            auVar77._20_4_ = auVar156._20_4_ * 0.0;
            auVar77._24_4_ = auVar156._24_4_ * 0.0;
            auVar77._28_4_ = 0;
            auVar177 = vfmsub231ps_fma(auVar77,ZEXT1632(auVar186),auVar124);
            auVar78._4_4_ = auVar178._4_4_ * auVar124._4_4_;
            auVar78._0_4_ = auVar178._0_4_ * auVar124._0_4_;
            auVar78._8_4_ = auVar178._8_4_ * auVar124._8_4_;
            auVar78._12_4_ = auVar178._12_4_ * auVar124._12_4_;
            auVar78._16_4_ = auVar124._16_4_ * 0.0;
            auVar78._20_4_ = auVar124._20_4_ * 0.0;
            auVar78._24_4_ = auVar124._24_4_ * 0.0;
            auVar78._28_4_ = auVar124._28_4_;
            auVar166 = ZEXT1632(auVar178);
            auVar124 = vsubps_avx(ZEXT1632(auVar185),auVar166);
            auVar126 = ZEXT1632(auVar28);
            auVar20 = vfmsub231ps_fma(auVar78,auVar126,auVar124);
            auVar79._4_4_ = auVar186._4_4_ * auVar124._4_4_;
            auVar79._0_4_ = auVar186._0_4_ * auVar124._0_4_;
            auVar79._8_4_ = auVar186._8_4_ * auVar124._8_4_;
            auVar79._12_4_ = auVar186._12_4_ * auVar124._12_4_;
            auVar79._16_4_ = auVar124._16_4_ * 0.0;
            auVar79._20_4_ = auVar124._20_4_ * 0.0;
            auVar79._24_4_ = auVar124._24_4_ * 0.0;
            auVar79._28_4_ = auVar124._28_4_;
            auVar178 = vfmsub231ps_fma(auVar79,auVar166,auVar156);
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar178),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar177));
            auVar117 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,2);
            auVar156 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar14),auVar117);
            auVar124 = vblendvps_avx(ZEXT1632(auVar27),ZEXT1632(auVar16),auVar117);
            auVar170 = vblendvps_avx(ZEXT1632(auVar187),ZEXT1632(auVar112),auVar117);
            auVar150 = vblendvps_avx(auVar166,ZEXT1632(auVar185),auVar117);
            auVar22 = vblendvps_avx(ZEXT1632(auVar186),ZEXT1632(auVar157),auVar117);
            auVar23 = vblendvps_avx(auVar126,ZEXT1632(auVar10),auVar117);
            auVar166 = vblendvps_avx(ZEXT1632(auVar185),auVar166,auVar117);
            auVar24 = vblendvps_avx(ZEXT1632(auVar157),ZEXT1632(auVar186),auVar117);
            auVar20 = vpackssdw_avx(local_520._0_16_,local_520._16_16_);
            auVar126 = vblendvps_avx(ZEXT1632(auVar10),auVar126,auVar117);
            auVar166 = vsubps_avx(auVar166,auVar156);
            auVar24 = vsubps_avx(auVar24,auVar124);
            auVar143 = vsubps_avx(auVar126,auVar170);
            auVar208 = ZEXT3264(auVar143);
            auVar163 = vsubps_avx(auVar156,auVar150);
            auVar188 = vsubps_avx(auVar124,auVar22);
            auVar189 = vsubps_avx(auVar170,auVar23);
            auVar167._0_4_ = auVar143._0_4_ * auVar156._0_4_;
            auVar167._4_4_ = auVar143._4_4_ * auVar156._4_4_;
            auVar167._8_4_ = auVar143._8_4_ * auVar156._8_4_;
            auVar167._12_4_ = auVar143._12_4_ * auVar156._12_4_;
            auVar167._16_4_ = auVar143._16_4_ * auVar156._16_4_;
            auVar167._20_4_ = auVar143._20_4_ * auVar156._20_4_;
            auVar167._24_4_ = auVar143._24_4_ * auVar156._24_4_;
            auVar167._28_4_ = 0;
            auVar10 = vfmsub231ps_fma(auVar167,auVar170,auVar166);
            auVar80._4_4_ = auVar166._4_4_ * auVar124._4_4_;
            auVar80._0_4_ = auVar166._0_4_ * auVar124._0_4_;
            auVar80._8_4_ = auVar166._8_4_ * auVar124._8_4_;
            auVar80._12_4_ = auVar166._12_4_ * auVar124._12_4_;
            auVar80._16_4_ = auVar166._16_4_ * auVar124._16_4_;
            auVar80._20_4_ = auVar166._20_4_ * auVar124._20_4_;
            auVar80._24_4_ = auVar166._24_4_ * auVar124._24_4_;
            auVar80._28_4_ = auVar126._28_4_;
            auVar14 = vfmsub231ps_fma(auVar80,auVar156,auVar24);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar10),_DAT_01faff00);
            auVar168._0_4_ = auVar24._0_4_ * auVar170._0_4_;
            auVar168._4_4_ = auVar24._4_4_ * auVar170._4_4_;
            auVar168._8_4_ = auVar24._8_4_ * auVar170._8_4_;
            auVar168._12_4_ = auVar24._12_4_ * auVar170._12_4_;
            auVar168._16_4_ = auVar24._16_4_ * auVar170._16_4_;
            auVar168._20_4_ = auVar24._20_4_ * auVar170._20_4_;
            auVar168._24_4_ = auVar24._24_4_ * auVar170._24_4_;
            auVar168._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar168,auVar124,auVar143);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar169._0_4_ = auVar189._0_4_ * auVar150._0_4_;
            auVar169._4_4_ = auVar189._4_4_ * auVar150._4_4_;
            auVar169._8_4_ = auVar189._8_4_ * auVar150._8_4_;
            auVar169._12_4_ = auVar189._12_4_ * auVar150._12_4_;
            auVar169._16_4_ = auVar189._16_4_ * auVar150._16_4_;
            auVar169._20_4_ = auVar189._20_4_ * auVar150._20_4_;
            auVar169._24_4_ = auVar189._24_4_ * auVar150._24_4_;
            auVar169._28_4_ = 0;
            auVar10 = vfmsub231ps_fma(auVar169,auVar163,auVar23);
            auVar81._4_4_ = auVar188._4_4_ * auVar23._4_4_;
            auVar81._0_4_ = auVar188._0_4_ * auVar23._0_4_;
            auVar81._8_4_ = auVar188._8_4_ * auVar23._8_4_;
            auVar81._12_4_ = auVar188._12_4_ * auVar23._12_4_;
            auVar81._16_4_ = auVar188._16_4_ * auVar23._16_4_;
            auVar81._20_4_ = auVar188._20_4_ * auVar23._20_4_;
            auVar81._24_4_ = auVar188._24_4_ * auVar23._24_4_;
            auVar81._28_4_ = auVar23._28_4_;
            auVar112 = vfmsub231ps_fma(auVar81,auVar22,auVar189);
            auVar82._4_4_ = auVar163._4_4_ * auVar22._4_4_;
            auVar82._0_4_ = auVar163._0_4_ * auVar22._0_4_;
            auVar82._8_4_ = auVar163._8_4_ * auVar22._8_4_;
            auVar82._12_4_ = auVar163._12_4_ * auVar22._12_4_;
            auVar82._16_4_ = auVar163._16_4_ * auVar22._16_4_;
            auVar82._20_4_ = auVar163._20_4_ * auVar22._20_4_;
            auVar82._24_4_ = auVar163._24_4_ * auVar22._24_4_;
            auVar82._28_4_ = auVar22._28_4_;
            auVar185 = vfmsub231ps_fma(auVar82,auVar188,auVar150);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar185),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar112));
            auVar150 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar112));
            auVar150 = vcmpps_avx(auVar150,ZEXT832(0) << 0x20,2);
            auVar10 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
            auVar20 = vpand_avx(auVar20,auVar10);
            auVar150 = vpmovsxwd_avx2(auVar20);
            if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar150 >> 0x7f,0) == '\0') &&
                  (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar150 >> 0xbf,0) == '\0') &&
                (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar150[0x1f]) {
LAB_017f8266:
              auVar135 = ZEXT3264(CONCAT824(uStack_628,
                                            CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
              auVar195 = ZEXT3264(auVar192);
            }
            else {
              auVar83._4_4_ = auVar24._4_4_ * auVar189._4_4_;
              auVar83._0_4_ = auVar24._0_4_ * auVar189._0_4_;
              auVar83._8_4_ = auVar24._8_4_ * auVar189._8_4_;
              auVar83._12_4_ = auVar24._12_4_ * auVar189._12_4_;
              auVar83._16_4_ = auVar24._16_4_ * auVar189._16_4_;
              auVar83._20_4_ = auVar24._20_4_ * auVar189._20_4_;
              auVar83._24_4_ = auVar24._24_4_ * auVar189._24_4_;
              auVar83._28_4_ = auVar150._28_4_;
              auVar177 = vfmsub231ps_fma(auVar83,auVar188,auVar143);
              auVar183._0_4_ = auVar143._0_4_ * auVar163._0_4_;
              auVar183._4_4_ = auVar143._4_4_ * auVar163._4_4_;
              auVar183._8_4_ = auVar143._8_4_ * auVar163._8_4_;
              auVar183._12_4_ = auVar143._12_4_ * auVar163._12_4_;
              auVar183._16_4_ = auVar143._16_4_ * auVar163._16_4_;
              auVar183._20_4_ = auVar143._20_4_ * auVar163._20_4_;
              auVar183._24_4_ = auVar143._24_4_ * auVar163._24_4_;
              auVar183._28_4_ = 0;
              auVar157 = vfmsub231ps_fma(auVar183,auVar166,auVar189);
              auVar84._4_4_ = auVar166._4_4_ * auVar188._4_4_;
              auVar84._0_4_ = auVar166._0_4_ * auVar188._0_4_;
              auVar84._8_4_ = auVar166._8_4_ * auVar188._8_4_;
              auVar84._12_4_ = auVar166._12_4_ * auVar188._12_4_;
              auVar84._16_4_ = auVar166._16_4_ * auVar188._16_4_;
              auVar84._20_4_ = auVar166._20_4_ * auVar188._20_4_;
              auVar84._24_4_ = auVar166._24_4_ * auVar188._24_4_;
              auVar84._28_4_ = auVar188._28_4_;
              auVar178 = vfmsub231ps_fma(auVar84,auVar163,auVar24);
              auVar10 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar157),ZEXT1632(auVar178));
              auVar185 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar177),ZEXT832(0) << 0x20);
              auVar150 = vrcpps_avx(ZEXT1632(auVar185));
              auVar206._8_4_ = 0x3f800000;
              auVar206._0_8_ = 0x3f8000003f800000;
              auVar206._12_4_ = 0x3f800000;
              auVar206._16_4_ = 0x3f800000;
              auVar206._20_4_ = 0x3f800000;
              auVar206._24_4_ = 0x3f800000;
              auVar206._28_4_ = 0x3f800000;
              auVar208 = ZEXT3264(auVar206);
              auVar10 = vfnmadd213ps_fma(auVar150,ZEXT1632(auVar185),auVar206);
              auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar150,auVar150);
              auVar154._0_4_ = auVar178._0_4_ * auVar170._0_4_;
              auVar154._4_4_ = auVar178._4_4_ * auVar170._4_4_;
              auVar154._8_4_ = auVar178._8_4_ * auVar170._8_4_;
              auVar154._12_4_ = auVar178._12_4_ * auVar170._12_4_;
              auVar154._16_4_ = auVar170._16_4_ * 0.0;
              auVar154._20_4_ = auVar170._20_4_ * 0.0;
              auVar154._24_4_ = auVar170._24_4_ * 0.0;
              auVar154._28_4_ = 0;
              auVar157 = vfmadd231ps_fma(auVar154,ZEXT1632(auVar157),auVar124);
              auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar156,ZEXT1632(auVar177));
              fVar137 = auVar10._0_4_;
              fVar136 = auVar10._4_4_;
              fVar171 = auVar10._8_4_;
              fVar172 = auVar10._12_4_;
              auVar170 = ZEXT1632(CONCAT412(fVar172 * auVar157._12_4_,
                                            CONCAT48(fVar171 * auVar157._8_4_,
                                                     CONCAT44(fVar136 * auVar157._4_4_,
                                                              fVar137 * auVar157._0_4_))));
              uVar199 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar155._4_4_ = uVar199;
              auVar155._0_4_ = uVar199;
              auVar155._8_4_ = uVar199;
              auVar155._12_4_ = uVar199;
              auVar155._16_4_ = uVar199;
              auVar155._20_4_ = uVar199;
              auVar155._24_4_ = uVar199;
              auVar155._28_4_ = uVar199;
              auVar97._4_4_ = uStack_11c;
              auVar97._0_4_ = local_120;
              auVar97._8_4_ = uStack_118;
              auVar97._12_4_ = uStack_114;
              auVar97._16_4_ = uStack_110;
              auVar97._20_4_ = uStack_10c;
              auVar97._24_4_ = uStack_108;
              auVar97._28_4_ = uStack_104;
              auVar156 = vcmpps_avx(auVar97,auVar170,2);
              auVar124 = vcmpps_avx(auVar170,auVar155,2);
              auVar156 = vandps_avx(auVar124,auVar156);
              auVar10 = vpackssdw_avx(auVar156._0_16_,auVar156._16_16_);
              auVar20 = vpand_avx(auVar20,auVar10);
              auVar156 = vpmovsxwd_avx2(auVar20);
              if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar156 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar156 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar156 >> 0x7f,0) == '\0') &&
                    (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar156 >> 0xbf,0) == '\0') &&
                  (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar156[0x1f]) goto LAB_017f8266;
              auVar156 = vcmpps_avx(ZEXT1632(auVar185),ZEXT832(0) << 0x20,4);
              auVar10 = vpackssdw_avx(auVar156._0_16_,auVar156._16_16_);
              auVar20 = vpand_avx(auVar20,auVar10);
              auVar156 = vpmovsxwd_avx2(auVar20);
              auVar135 = ZEXT3264(CONCAT824(uStack_628,
                                            CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
              auVar195 = ZEXT3264(auVar192);
              if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar156 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar156 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar156 >> 0x7f,0) != '\0') ||
                    (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar156 >> 0xbf,0) != '\0') ||
                  (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar156[0x1f] < '\0') {
                auVar150 = ZEXT1632(CONCAT412(fVar172 * auVar14._12_4_,
                                              CONCAT48(fVar171 * auVar14._8_4_,
                                                       CONCAT44(fVar136 * auVar14._4_4_,
                                                                fVar137 * auVar14._0_4_))));
                auVar85._28_4_ = SUB84(uStack_628,4);
                auVar85._0_28_ =
                     ZEXT1628(CONCAT412(fVar172 * auVar112._12_4_,
                                        CONCAT48(fVar171 * auVar112._8_4_,
                                                 CONCAT44(fVar136 * auVar112._4_4_,
                                                          fVar137 * auVar112._0_4_))));
                auVar190._8_4_ = 0x3f800000;
                auVar190._0_8_ = 0x3f8000003f800000;
                auVar190._12_4_ = 0x3f800000;
                auVar190._16_4_ = 0x3f800000;
                auVar190._20_4_ = 0x3f800000;
                auVar190._24_4_ = 0x3f800000;
                auVar190._28_4_ = 0x3f800000;
                auVar124 = vsubps_avx(auVar190,auVar150);
                local_720 = vblendvps_avx(auVar124,auVar150,auVar117);
                auVar124 = vsubps_avx(auVar190,auVar85);
                local_4e0 = vblendvps_avx(auVar124,auVar85,auVar117);
                auVar135 = ZEXT3264(auVar156);
                auVar195 = ZEXT3264(auVar170);
              }
            }
            auVar201 = ZEXT3264(auVar115);
            auVar156 = auVar135._0_32_;
            if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar156 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar156 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar156 >> 0x7f,0) == '\0') &&
                  (auVar135 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar156 >> 0xbf,0) == '\0') &&
                (auVar135 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar135[0x1f]) goto LAB_017f7cd3;
            auVar124 = vsubps_avx(auVar127,_local_500);
            auVar20 = vfmadd213ps_fma(auVar124,local_720,_local_500);
            fVar137 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar86._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar137;
            auVar86._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar137;
            auVar86._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar137;
            auVar86._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar137;
            auVar86._16_4_ = fVar137 * 0.0;
            auVar86._20_4_ = fVar137 * 0.0;
            auVar86._24_4_ = fVar137 * 0.0;
            auVar86._28_4_ = fVar137;
            local_740 = auVar195._0_32_;
            auVar124 = vcmpps_avx(local_740,auVar86,6);
            auVar170 = auVar156 & auVar124;
            if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar170 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar170 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar170 >> 0x7f,0) == '\0') &&
                  (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar170 >> 0xbf,0) == '\0') &&
                (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar170[0x1f]) {
              auVar135 = ZEXT3264(local_720);
            }
            else {
              auVar134._8_4_ = 0xbf800000;
              auVar134._0_8_ = 0xbf800000bf800000;
              auVar134._12_4_ = 0xbf800000;
              auVar134._16_4_ = 0xbf800000;
              auVar134._20_4_ = 0xbf800000;
              auVar134._24_4_ = 0xbf800000;
              auVar134._28_4_ = 0xbf800000;
              auVar151._8_4_ = 0x40000000;
              auVar151._0_8_ = 0x4000000040000000;
              auVar151._12_4_ = 0x40000000;
              auVar151._16_4_ = 0x40000000;
              auVar151._20_4_ = 0x40000000;
              auVar151._24_4_ = 0x40000000;
              auVar151._28_4_ = 0x40000000;
              auVar20 = vfmadd213ps_fma(local_4e0,auVar151,auVar134);
              local_3c0 = local_720;
              local_3a0 = ZEXT1632(auVar20);
              pGVar18 = (context->scene->geometries).items[(uint)local_940._4_4_].ptr;
              auVar135 = ZEXT3264(local_720);
              local_4e0 = local_3a0;
              if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                bVar100 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar100 = 1, pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar156 = vandps_avx(auVar124,auVar156);
                auVar208 = ZEXT1264(ZEXT812(0));
                fVar137 = (float)local_360;
                local_2e0[0] = (fVar137 + local_720._0_4_ + 0.0) * local_160;
                local_2e0[1] = (fVar137 + local_720._4_4_ + 1.0) * fStack_15c;
                local_2e0[2] = (fVar137 + local_720._8_4_ + 2.0) * fStack_158;
                local_2e0[3] = (fVar137 + local_720._12_4_ + 3.0) * fStack_154;
                fStack_2d0 = (fVar137 + local_720._16_4_ + 4.0) * fStack_150;
                fStack_2cc = (fVar137 + local_720._20_4_ + 5.0) * fStack_14c;
                fStack_2c8 = (fVar137 + local_720._24_4_ + 6.0) * fStack_148;
                fStack_2c4 = fVar137 + local_720._28_4_ + 7.0;
                local_4e0._0_8_ = auVar20._0_8_;
                local_4e0._8_8_ = auVar20._8_8_;
                local_2c0 = local_4e0._0_8_;
                uStack_2b8 = local_4e0._8_8_;
                uStack_2b0 = 0;
                uStack_2a8 = 0;
                local_2a0 = local_740;
                uVar103 = vmovmskps_avx(auVar156);
                if (uVar103 == 0) {
                  bVar100 = 0;
LAB_017f82ad:
                  auVar135 = ZEXT3264(local_720);
                  auVar195 = ZEXT3264(local_740);
                }
                else {
                  uVar105 = (ulong)(uVar103 & 0xff);
                  local_920 = ZEXT1632(CONCAT88(auVar16._8_8_,uVar105));
                  local_960 = 0;
                  for (; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000) {
                    local_960 = local_960 + 1;
                  }
                  local_620 = ZEXT1632(CONCAT124(auVar21._4_12_,*(undefined4 *)(ray + k * 4 + 0x100)
                                                ));
                  local_380 = local_740;
                  local_35c = iVar104;
                  local_350 = uVar184;
                  uStack_348 = uVar92;
                  local_340 = uVar93;
                  uStack_338 = uVar94;
                  local_330 = uVar95;
                  uStack_328 = uVar96;
                  do {
                    fVar137 = local_2e0[local_960];
                    auVar114._4_4_ = fVar137;
                    auVar114._0_4_ = fVar137;
                    auVar114._8_4_ = fVar137;
                    auVar114._12_4_ = fVar137;
                    local_220._16_4_ = fVar137;
                    local_220._0_16_ = auVar114;
                    local_220._20_4_ = fVar137;
                    local_220._24_4_ = fVar137;
                    local_220._28_4_ = fVar137;
                    local_200 = *(undefined4 *)((long)&local_2c0 + local_960 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_2a0 + local_960 * 4);
                    fVar136 = 1.0 - fVar137;
                    auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar114,
                                              ZEXT416(0xc0a00000));
                    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * fVar137 * 3.0)),
                                              ZEXT416((uint)(fVar137 + fVar137)),auVar20);
                    auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar114,
                                              ZEXT416(0x40000000));
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * fVar136 * -3.0)),
                                              ZEXT416((uint)(fVar136 + fVar136)),auVar20);
                    auVar14 = vfnmadd231ss_fma(ZEXT416((uint)(fVar137 * (fVar136 + fVar136))),
                                               ZEXT416((uint)fVar136),ZEXT416((uint)fVar136));
                    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * fVar137)),auVar114,
                                              ZEXT416((uint)(fVar136 * -2.0)));
                    fVar137 = auVar20._0_4_ * 0.5;
                    fVar136 = auVar10._0_4_ * 0.5;
                    auVar160._0_4_ = fVar136 * local_6f0;
                    auVar160._4_4_ = fVar136 * fStack_6ec;
                    auVar160._8_4_ = fVar136 * fStack_6e8;
                    auVar160._12_4_ = fVar136 * fStack_6e4;
                    auVar141._4_4_ = fVar137;
                    auVar141._0_4_ = fVar137;
                    auVar141._8_4_ = fVar137;
                    auVar141._12_4_ = fVar137;
                    auVar20 = vfmadd132ps_fma(auVar141,auVar160,auVar11);
                    fVar137 = auVar21._0_4_ * 0.5;
                    auVar161._4_4_ = fVar137;
                    auVar161._0_4_ = fVar137;
                    auVar161._8_4_ = fVar137;
                    auVar161._12_4_ = fVar137;
                    auVar20 = vfmadd132ps_fma(auVar161,auVar20,auVar12);
                    local_770.context = context->user;
                    fVar137 = auVar14._0_4_ * 0.5;
                    auVar142._4_4_ = fVar137;
                    auVar142._0_4_ = fVar137;
                    auVar142._8_4_ = fVar137;
                    auVar142._12_4_ = fVar137;
                    auVar21 = vfmadd132ps_fma(auVar142,auVar20,auVar13);
                    local_280 = auVar21._0_4_;
                    uStack_27c = local_280;
                    uStack_278 = local_280;
                    uStack_274 = local_280;
                    uStack_270 = local_280;
                    uStack_26c = local_280;
                    uStack_268 = local_280;
                    uStack_264 = local_280;
                    auVar20 = vmovshdup_avx(auVar21);
                    local_260 = auVar20._0_8_;
                    uStack_258 = local_260;
                    uStack_250 = local_260;
                    uStack_248 = local_260;
                    auVar20 = vshufps_avx(auVar21,auVar21,0xaa);
                    local_240._8_8_ = auVar20._0_8_;
                    local_240._0_8_ = local_240._8_8_;
                    local_240._16_8_ = local_240._8_8_;
                    local_240._24_8_ = local_240._8_8_;
                    uStack_1fc = local_200;
                    uStack_1f8 = local_200;
                    uStack_1f4 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1ec = local_200;
                    uStack_1e8 = local_200;
                    uStack_1e4 = local_200;
                    local_1e0 = local_540;
                    uStack_1d8 = CONCAT44(uStack_534,uStack_538);
                    uStack_1d0 = CONCAT44(uStack_52c,uStack_530);
                    uStack_1c8 = CONCAT44(uStack_524,uStack_528);
                    local_1c0._4_4_ = uStack_13c;
                    local_1c0._0_4_ = local_140;
                    local_1c0._8_4_ = uStack_138;
                    local_1c0._12_4_ = uStack_134;
                    local_1c0._16_4_ = uStack_130;
                    local_1c0._20_4_ = uStack_12c;
                    local_1c0._24_4_ = uStack_128;
                    local_1c0._28_4_ = uStack_124;
                    vpcmpeqd_avx2(local_1c0,local_1c0);
                    local_1a0 = (local_770.context)->instID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = (local_770.context)->instPrimID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_680 = local_420;
                    local_770.valid = (int *)local_680;
                    local_770.geometryUserPtr = pGVar18->userPtr;
                    local_770.hit = (RTCHitN *)&local_280;
                    local_770.N = 8;
                    local_770.ray = (RTCRayN *)ray;
                    if (pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar208 = ZEXT1664(auVar208._0_16_);
                      (*pGVar18->occlusionFilterN)(&local_770);
                    }
                    auVar124 = vpcmpeqd_avx2(local_680,_DAT_01faff00);
                    auVar156 = _DAT_01fe9960 & ~auVar124;
                    if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar156 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar156 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar156 >> 0x7f,0) == '\0') &&
                          (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar156 >> 0xbf,0) == '\0') &&
                        (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar156[0x1f]) {
                      auVar124 = auVar124 ^ _DAT_01fe9960;
                    }
                    else {
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar208 = ZEXT1664(auVar208._0_16_);
                        (*p_Var19)(&local_770);
                      }
                      auVar156 = vpcmpeqd_avx2(local_680,_DAT_01faff00);
                      auVar124 = auVar156 ^ _DAT_01fe9960;
                      auVar152._8_4_ = 0xff800000;
                      auVar152._0_8_ = 0xff800000ff800000;
                      auVar152._12_4_ = 0xff800000;
                      auVar152._16_4_ = 0xff800000;
                      auVar152._20_4_ = 0xff800000;
                      auVar152._24_4_ = 0xff800000;
                      auVar152._28_4_ = 0xff800000;
                      auVar156 = vblendvps_avx(auVar152,*(undefined1 (*) [32])
                                                         (local_770.ray + 0x100),auVar156);
                      *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar156;
                    }
                    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar124 >> 0x7f,0) != '\0') ||
                          (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar124 >> 0xbf,0) != '\0') ||
                        (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar124[0x1f] < '\0') {
                      bVar100 = 1;
                      goto LAB_017f82ad;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_620._0_4_;
                    uVar106 = local_920._0_8_ ^ 1L << (local_960 & 0x3f);
                    bVar100 = 0;
                    local_920._0_8_ = uVar106;
                    local_960 = 0;
                    for (uVar105 = uVar106; (uVar105 & 1) == 0;
                        uVar105 = uVar105 >> 1 | 0x8000000000000000) {
                      local_960 = local_960 + 1;
                    }
                    auVar135 = ZEXT3264(local_720);
                    auVar195 = ZEXT3264(local_740);
                  } while (uVar106 != 0);
                }
              }
              auVar201 = ZEXT3264(auVar115);
              bVar102 = (bool)(bVar102 | bVar100);
            }
          }
          local_720 = auVar135._0_32_;
          lVar108 = lVar108 + 8;
        } while ((int)lVar108 < iVar104);
      }
      if (bVar102) {
        return bVar102;
      }
      uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar125._4_4_ = uVar110;
      auVar125._0_4_ = uVar110;
      auVar125._8_4_ = uVar110;
      auVar125._12_4_ = uVar110;
      auVar125._16_4_ = uVar110;
      auVar125._20_4_ = uVar110;
      auVar125._24_4_ = uVar110;
      auVar125._28_4_ = uVar110;
      auVar115 = vcmpps_avx(local_80,auVar125,2);
      uVar103 = vmovmskps_avx(auVar115);
      uVar103 = (uint)uVar109 & uVar103;
    } while (uVar103 != 0);
  }
  return bVar102;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }